

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O3

void av1_warp_affine_avx2
               (int32_t *mat,uint8_t *ref,int width,int height,int stride,uint8_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,int16_t delta)

{
  int iVar1;
  WarpedFilterCoeff aWVar2 [8];
  CONV_BUF_TYPE *pCVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  byte bVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  uint uVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  byte bVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  int iVar50;
  int iVar51;
  uint uVar52;
  ulong uVar53;
  long lVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  undefined1 (*pauVar59) [32];
  int iVar60;
  int iVar61;
  int iVar62;
  uint uVar63;
  int iVar64;
  int iVar65;
  ulong uVar66;
  long lVar67;
  int iVar68;
  uint uVar69;
  long lVar70;
  int iVar71;
  int iVar72;
  uint uVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  uint uVar77;
  int iVar78;
  int iVar79;
  long lVar80;
  int iVar81;
  uint uVar82;
  int iVar83;
  uint uVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  long lVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  uint uVar98;
  uint uVar99;
  long lVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  long lVar105;
  undefined2 uVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  short sVar121;
  undefined1 auVar122 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  short sVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar153 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar161 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [64];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar245 [64];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar252 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [64];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  __m256i horz_out [8];
  uint8_t *local_588;
  uint8_t *local_580;
  int local_560;
  ulong local_550;
  ulong local_538;
  undefined1 local_490 [16];
  undefined1 (*local_460) [32];
  undefined1 local_420 [32];
  uint8_t *local_400;
  uint8_t *local_360;
  undefined1 local_300 [32];
  undefined1 local_2e0 [384];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [176];
  undefined1 auVar115 [32];
  undefined1 auVar131 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar140 [32];
  undefined1 auVar152 [32];
  undefined1 auVar154 [32];
  undefined1 auVar160 [32];
  undefined1 auVar170 [32];
  undefined1 auVar176 [32];
  undefined1 auVar208 [32];
  undefined1 auVar217 [32];
  undefined1 auVar225 [32];
  undefined1 auVar244 [32];
  undefined1 auVar251 [32];
  undefined1 auVar257 [32];
  
  uVar63 = conv_params->round_0;
  if (conv_params->is_compound == 0) {
    uVar77 = 0xe - uVar63;
    uVar33 = conv_params->round_1;
  }
  else {
    uVar33 = conv_params->round_1;
    uVar77 = uVar33;
  }
  bVar29 = (byte)uVar63;
  bVar43 = (0x16 - bVar29) - (char)uVar33;
  uVar33 = 0xe - (uVar63 + uVar33);
  if (conv_params->is_compound == 1) {
    iVar85 = 1 << (0x16 - bVar29 & 0x1f);
  }
  else {
    iVar85 = -1 << ((byte)uVar77 + 7 & 0x1f);
  }
  iVar85 = ((1 << ((byte)uVar77 & 0x1f)) >> 1) + iVar85;
  if (0 < p_height) {
    sVar141 = (short)((uint)(1 << (bVar29 & 0x1f)) >> 1) + 0x4000;
    auVar235 = ZEXT464(uVar63);
    iVar86 = (int)alpha;
    iVar68 = (int)beta;
    iVar1 = height + -1;
    iVar71 = (0x10000 << (0xe - bVar29 & 0x1f)) >> 0x10;
    iVar34 = (0x10000 << (7 - bVar29 & 0x1f)) >> 0x10;
    iVar81 = (int)gamma;
    iVar89 = (int)delta;
    iVar4 = iVar86 * 7;
    sVar121 = (short)(-1 << (bVar43 - 1 & 0x1f)) + (short)(-1 << (bVar43 & 0x1f)) +
              (short)((uint)(1 << ((byte)uVar33 & 0x1f)) >> 1);
    iVar96 = iVar4 + 0x10200 + iVar68 * -3;
    iVar12 = iVar86 * 2;
    iVar5 = iVar86 * 6;
    iVar44 = iVar5 + 0x10200 + iVar68 * -3;
    iVar6 = iVar86 * 5;
    iVar45 = iVar6 + 0x10200 + iVar68 * -3;
    iVar60 = iVar86 * 4;
    iVar46 = iVar60 + 0x10200 + iVar68 * -3;
    iVar7 = iVar86 * 3;
    uVar47 = iVar7 + 0x10200 + iVar68 * -3;
    uVar48 = iVar12 + 0x10200 + iVar68 * -3;
    uVar49 = iVar86 + 0x10200 + iVar68 * -3;
    iVar50 = iVar68 * -3 + 0x10200;
    uVar106 = (undefined2)conv_params->fwd_offset;
    auVar169._2_2_ = uVar106;
    auVar169._0_2_ = uVar106;
    auVar169._4_2_ = uVar106;
    auVar169._6_2_ = uVar106;
    auVar169._8_2_ = uVar106;
    auVar169._10_2_ = uVar106;
    auVar169._12_2_ = uVar106;
    auVar169._14_2_ = uVar106;
    auVar169._16_2_ = uVar106;
    auVar169._18_2_ = uVar106;
    auVar169._20_2_ = uVar106;
    auVar169._22_2_ = uVar106;
    auVar169._24_2_ = uVar106;
    auVar169._26_2_ = uVar106;
    auVar169._28_2_ = uVar106;
    auVar169._30_2_ = uVar106;
    uVar106 = (undefined2)conv_params->bck_offset;
    auVar178._2_2_ = uVar106;
    auVar178._0_2_ = uVar106;
    auVar178._4_2_ = uVar106;
    auVar178._6_2_ = uVar106;
    auVar178._8_2_ = uVar106;
    auVar178._10_2_ = uVar106;
    auVar178._12_2_ = uVar106;
    auVar178._14_2_ = uVar106;
    auVar178._16_2_ = uVar106;
    auVar178._18_2_ = uVar106;
    auVar178._20_2_ = uVar106;
    auVar178._22_2_ = uVar106;
    auVar178._24_2_ = uVar106;
    auVar178._26_2_ = uVar106;
    auVar178._28_2_ = uVar106;
    auVar178._30_2_ = uVar106;
    auVar169 = vpunpcklwd_avx2(auVar169,auVar178);
    auVar238._2_2_ = sVar141;
    auVar238._0_2_ = sVar141;
    auVar238._4_2_ = sVar141;
    auVar238._6_2_ = sVar141;
    auVar238._8_2_ = sVar141;
    auVar238._10_2_ = sVar141;
    auVar238._12_2_ = sVar141;
    auVar238._14_2_ = sVar141;
    auVar238._16_2_ = sVar141;
    auVar238._18_2_ = sVar141;
    auVar238._20_2_ = sVar141;
    auVar238._22_2_ = sVar141;
    auVar238._24_2_ = sVar141;
    auVar238._26_2_ = sVar141;
    auVar238._28_2_ = sVar141;
    auVar238._30_2_ = sVar141;
    iVar8 = iVar81 * 7;
    iVar13 = iVar68 * 2;
    iVar102 = iVar4 + 0x10200 + iVar68 * -2;
    iVar78 = iVar5 + 0x10200 + iVar68 * -2;
    iVar75 = iVar6 + 0x10200 + iVar68 * -2;
    iVar72 = iVar60 + 0x10200 + iVar68 * -2;
    iVar61 = iVar7 + 0x10200 + iVar68 * -2;
    iVar97 = iVar12 + 0x10200 + iVar68 * -2;
    iVar87 = iVar86 + 0x10200 + iVar68 * -2;
    iVar62 = iVar68 * -2 + 0x10200;
    auVar245 = ZEXT3264(CONCAT1616(_DAT_0056c940,_DAT_0056c940));
    auVar252 = ZEXT3264(CONCAT1616(_DAT_0056d060,_DAT_0056d060));
    auVar258 = ZEXT3264(CONCAT1616(_DAT_0056d070,_DAT_0056d070));
    auVar263 = ZEXT3264(CONCAT1616(_DAT_0056d080,_DAT_0056d080));
    iVar35 = width + -1;
    iVar9 = iVar81 * 6;
    iVar10 = iVar81 * 3;
    iVar11 = iVar81 * 5;
    lVar80 = (long)p_stride;
    uVar39 = (ulong)(uint)p_height;
    local_360 = pred + lVar80;
    local_538 = 0;
    auVar232 = ZEXT416(uVar63);
    local_400 = pred;
    do {
      uVar63 = 8;
      if ((uint)p_height < 8) {
        uVar63 = p_height;
      }
      uVar73 = 8;
      if (p_height < 8) {
        uVar73 = p_height;
      }
      if (uVar63 < 3) {
        uVar63 = 2;
      }
      iVar51 = uVar73 - 2;
      if ((int)(uVar73 - 2) < -5) {
        iVar51 = -6;
      }
      if ((int)uVar73 < -3) {
        uVar73 = 0xfffffffc;
      }
      if (0 < p_width) {
        uVar53 = (ulong)(uVar63 - 1 & 0xfffffffe);
        uVar66 = (ulong)(iVar51 + 7U >> 1);
        lVar54 = uVar66 * 0x20 + 0x20;
        uVar55 = (ulong)(uVar73 + 5 >> 1);
        lVar67 = uVar55 * 0x10 + 0x10;
        uVar63 = 8;
        if (p_height < 8) {
          uVar63 = p_height;
        }
        iVar51 = uVar63 - 2;
        if (iVar51 < -5) {
          iVar51 = -6;
        }
        uVar56 = (ulong)((iVar51 + 7U >> 1) + 1);
        iVar64 = (int)local_538;
        lVar105 = (long)(p_row + 4 + iVar64 << ((byte)subsampling_y & 0x1f));
        lVar40 = uVar39 - local_538;
        iVar51 = 8;
        if ((int)lVar40 < 8) {
          iVar51 = (int)lVar40;
        }
        if (iVar51 < -3) {
          iVar51 = -4;
        }
        uVar57 = (ulong)((iVar51 + 5U >> 1) + 1);
        local_588 = local_400;
        local_580 = local_360;
        lVar70 = 0;
        do {
          auVar139 = local_2e0._0_32_;
          auVar178 = local_300;
          auVar108 = local_490;
          auVar262 = auVar263._0_32_;
          auVar179 = auVar258._0_32_;
          auVar250 = auVar252._0_32_;
          auVar243 = auVar245._0_32_;
          auVar127 = auVar235._0_16_;
          lVar41 = (long)(p_col + 4 + (int)lVar70 << ((byte)subsampling_x & 0x1f));
          lVar100 = (long)*mat + mat[3] * lVar105 + mat[2] * lVar41 >> ((byte)subsampling_x & 0x3f);
          lVar41 = (long)mat[1] + mat[5] * lVar105 + mat[4] * lVar41 >> ((byte)subsampling_y & 0x3f)
          ;
          uVar63 = (uint)((ulong)lVar100 >> 0x10);
          iVar51 = (int)((ulong)lVar41 >> 0x10);
          uVar42 = uVar56;
          if ((int)uVar63 < -6) {
            if (lVar40 < -5) {
              iVar36 = -7;
              uVar42 = 0;
            }
            else {
              iVar79 = iVar51 + -7;
              iVar65 = iVar51 + -6;
              iVar36 = 7;
              lVar100 = 0;
              do {
                iVar91 = iVar1;
                if (iVar79 < iVar1) {
                  iVar91 = iVar79;
                }
                if (iVar79 < 0) {
                  iVar91 = 0;
                }
                uVar106 = (undefined2)((uint)ref[iVar91 * stride] * iVar34 + iVar71);
                iVar91 = iVar1;
                if (iVar65 < iVar1) {
                  iVar91 = iVar65;
                }
                if (iVar79 < -1) {
                  iVar91 = 0;
                }
                auVar130._0_2_ = (undefined2)((uint)ref[iVar91 * stride] * iVar34 + iVar71);
                auVar130._2_2_ = auVar130._0_2_;
                auVar130._4_2_ = auVar130._0_2_;
                auVar130._6_2_ = auVar130._0_2_;
                auVar130._8_2_ = auVar130._0_2_;
                auVar130._10_2_ = auVar130._0_2_;
                auVar130._12_2_ = auVar130._0_2_;
                auVar130._14_2_ = auVar130._0_2_;
                auVar130._16_2_ = auVar130._0_2_;
                auVar130._18_2_ = auVar130._0_2_;
                auVar130._20_2_ = auVar130._0_2_;
                auVar130._22_2_ = auVar130._0_2_;
                auVar130._24_2_ = auVar130._0_2_;
                auVar130._26_2_ = auVar130._0_2_;
                auVar130._28_2_ = auVar130._0_2_;
                auVar130._30_2_ = auVar130._0_2_;
                auVar178 = vpblendd_avx2(ZEXT1632(CONCAT214(uVar106,CONCAT212(uVar106,CONCAT210(
                                                  uVar106,CONCAT28(uVar106,CONCAT26(uVar106,CONCAT24
                                                  (uVar106,CONCAT22(uVar106,uVar106)))))))),auVar130
                                         ,0xf0);
                *(undefined1 (*) [32])(local_160 + lVar100) = auVar178;
                lVar100 = lVar100 + 0x20;
                iVar36 = iVar36 + -2;
                iVar79 = iVar79 + 2;
                iVar65 = iVar65 + 2;
              } while (lVar54 != lVar100);
              iVar36 = -iVar36;
            }
            iVar36 = iVar36 + iVar51;
            iVar51 = iVar1;
            if (iVar36 < iVar1) {
              iVar51 = iVar36;
            }
            if (iVar36 < 0) {
              iVar51 = 0;
            }
            bVar43 = ref[iVar51 * stride];
LAB_0046593c:
            uVar106 = (undefined2)
                      (((uint)bVar43 << (7 - bVar29 & 0x1f)) + (1 << (0xe - bVar29 & 0x1f)));
            lVar100 = uVar42 * 0x20;
            *(undefined2 *)(local_160 + lVar100) = uVar106;
            *(undefined2 *)(local_160 + lVar100 + 2) = uVar106;
            *(undefined2 *)(local_160 + lVar100 + 4) = uVar106;
            *(undefined2 *)(local_160 + lVar100 + 6) = uVar106;
            *(undefined2 *)(local_160 + lVar100 + 8) = uVar106;
            *(undefined2 *)(local_160 + lVar100 + 10) = uVar106;
            *(undefined2 *)(local_160 + lVar100 + 0xc) = uVar106;
            *(undefined2 *)(local_160 + lVar100 + 0xe) = uVar106;
            *(undefined2 *)(local_160 + lVar100 + 0x10) = uVar106;
            *(undefined2 *)(local_140 + lVar100 + -0xe) = uVar106;
            *(undefined2 *)(local_140 + lVar100 + -0xc) = uVar106;
            *(undefined2 *)(local_140 + lVar100 + -10) = uVar106;
            *(undefined2 *)(local_140 + lVar100 + -8) = uVar106;
            *(undefined2 *)(local_140 + lVar100 + -6) = uVar106;
            *(undefined2 *)(local_140 + lVar100 + -4) = uVar106;
            *(undefined2 *)(local_140 + lVar100 + -2) = uVar106;
          }
          else {
            if (width + 6 <= (int)uVar63) {
              if (lVar40 < -5) {
                iVar36 = -7;
                uVar42 = 0;
              }
              else {
                iVar79 = iVar51 + -7;
                iVar65 = iVar51 + -6;
                iVar36 = 7;
                lVar100 = 0;
                do {
                  iVar91 = iVar1;
                  if (iVar79 < iVar1) {
                    iVar91 = iVar79;
                  }
                  if (iVar79 < 0) {
                    iVar91 = 0;
                  }
                  iVar95 = iVar1;
                  if (iVar65 < iVar1) {
                    iVar95 = iVar65;
                  }
                  if (iVar79 < -1) {
                    iVar95 = 0;
                  }
                  uVar106 = (undefined2)((uint)ref[iVar91 * stride + iVar35] * iVar34 + iVar71);
                  auVar139._0_2_ =
                       (undefined2)((uint)ref[iVar95 * stride + iVar35] * iVar34 + iVar71);
                  auVar139._2_2_ = auVar139._0_2_;
                  auVar139._4_2_ = auVar139._0_2_;
                  auVar139._6_2_ = auVar139._0_2_;
                  auVar139._8_2_ = auVar139._0_2_;
                  auVar139._10_2_ = auVar139._0_2_;
                  auVar139._12_2_ = auVar139._0_2_;
                  auVar139._14_2_ = auVar139._0_2_;
                  auVar139._16_2_ = auVar139._0_2_;
                  auVar139._18_2_ = auVar139._0_2_;
                  auVar139._20_2_ = auVar139._0_2_;
                  auVar139._22_2_ = auVar139._0_2_;
                  auVar139._24_2_ = auVar139._0_2_;
                  auVar139._26_2_ = auVar139._0_2_;
                  auVar139._28_2_ = auVar139._0_2_;
                  auVar139._30_2_ = auVar139._0_2_;
                  auVar178 = vpblendd_avx2(ZEXT1632(CONCAT214(uVar106,CONCAT212(uVar106,CONCAT210(
                                                  uVar106,CONCAT28(uVar106,CONCAT26(uVar106,CONCAT24
                                                  (uVar106,CONCAT22(uVar106,uVar106)))))))),auVar139
                                           ,0xf0);
                  *(undefined1 (*) [32])(local_160 + lVar100) = auVar178;
                  lVar100 = lVar100 + 0x20;
                  iVar36 = iVar36 + -2;
                  iVar79 = iVar79 + 2;
                  iVar65 = iVar65 + 2;
                } while (lVar54 != lVar100);
                iVar36 = -iVar36;
              }
              iVar36 = iVar36 + iVar51;
              iVar51 = iVar1;
              if (iVar36 < iVar1) {
                iVar51 = iVar36;
              }
              if (iVar36 < 0) {
                iVar51 = 0;
              }
              bVar43 = ref[iVar51 * stride + iVar35];
              goto LAB_0046593c;
            }
            uVar98 = ((uint)lVar100 & 0xfffc) + (iVar68 + iVar86) * -4 & 0xffffffc0;
            uVar82 = uVar98 + 0x10200;
            if (width < (int)(uVar63 + 9) || (int)uVar63 < 7) {
              uVar52 = (uVar63 - width) + 8;
              if (lVar40 < -5) {
                iVar74 = -7;
                uVar42 = 0;
              }
              else {
                lVar100 = (long)(int)uVar63 + -7;
                iVar74 = -7;
                pauVar59 = &local_160;
                lVar93 = uVar66 + 1;
                uVar69 = uVar47;
                iVar36 = iVar50;
                iVar79 = iVar45;
                iVar65 = iVar44;
                uVar84 = uVar48;
                iVar91 = iVar97;
                iVar95 = iVar87;
                uVar99 = uVar49;
                iVar101 = iVar46;
                iVar104 = iVar96;
                iVar90 = iVar61;
                iVar94 = iVar72;
                iVar83 = iVar75;
                iVar88 = iVar78;
                iVar37 = iVar102;
                iVar38 = iVar62;
                do {
                  auVar30._24_8_ = 0;
                  auVar30._0_24_ = local_300._8_24_;
                  local_300 = auVar30 << 0x40;
                  auVar31._24_8_ = 0;
                  auVar31._0_24_ = local_2e0._8_24_;
                  local_2e0._0_32_ = auVar31 << 0x40;
                  auVar32._8_8_ = 0;
                  auVar32._0_8_ = local_490._8_8_;
                  local_490 = auVar32 << 0x40;
                  iVar76 = iVar51 + iVar74;
                  iVar92 = iVar1;
                  if (iVar76 < iVar1) {
                    iVar92 = iVar76;
                  }
                  if (iVar76 < 0) {
                    iVar92 = 0;
                  }
                  iVar103 = iVar51 + iVar74 + 1;
                  if (iVar1 <= iVar103) {
                    iVar103 = iVar1;
                  }
                  if (iVar76 < -1) {
                    iVar103 = 0;
                  }
                  auVar108 = *(undefined1 (*) [16])(ref + iVar92 * stride + lVar100);
                  auVar127 = *(undefined1 (*) [16])(ref + iVar103 * stride + lVar100);
                  if ((int)uVar63 < 7) {
                    auVar108 = vpshufb_avx(auVar108,(undefined1  [16])warp_pad_left[6 - uVar63]);
                    auVar127 = vpshufb_avx(auVar127,(undefined1  [16])warp_pad_left[6 - uVar63]);
                  }
                  if (-1 < (int)uVar52) {
                    auVar108 = vpshufb_avx(auVar108,(undefined1  [16])warp_pad_right[uVar52]);
                    auVar127 = vpshufb_avx(auVar127,(undefined1  [16])warp_pad_right[uVar52]);
                  }
                  auVar109._0_16_ = ZEXT116(0) * auVar127 + ZEXT116(1) * auVar108;
                  auVar109._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar127;
                  auVar122._8_8_ = 0;
                  auVar122._0_8_ = av1_filter_8bit[iVar38 + uVar98 >> 10];
                  auVar142._8_8_ = 0;
                  auVar142._0_8_ = av1_filter_8bit[uVar98 + iVar36 >> 10];
                  auVar131._0_16_ = ZEXT116(0) * auVar122 + ZEXT116(1) * auVar142;
                  auVar131._16_16_ = ZEXT116(1) * auVar122;
                  auVar161._8_8_ = 0;
                  auVar161._0_8_ = av1_filter_8bit[uVar98 + iVar95 >> 10];
                  auVar183._8_8_ = 0;
                  auVar183._0_8_ = av1_filter_8bit[uVar98 + uVar99 >> 10];
                  auVar170._0_16_ = ZEXT116(0) * auVar161 + ZEXT116(1) * auVar183;
                  auVar170._16_16_ = ZEXT116(1) * auVar161;
                  auVar197._8_8_ = 0;
                  auVar197._0_8_ = av1_filter_8bit[uVar98 + iVar91 >> 10];
                  auVar209._8_8_ = 0;
                  auVar209._0_8_ = av1_filter_8bit[uVar98 + uVar84 >> 10];
                  auVar188._0_16_ = ZEXT116(0) * auVar197 + ZEXT116(1) * auVar209;
                  auVar188._16_16_ = ZEXT116(1) * auVar197;
                  auVar178 = vpunpcklwd_avx2(auVar131,auVar188);
                  auVar219._8_8_ = 0;
                  auVar219._0_8_ = av1_filter_8bit[uVar98 + iVar90 >> 10];
                  auVar227._8_8_ = 0;
                  auVar227._0_8_ = av1_filter_8bit[uVar98 + uVar69 >> 10];
                  auVar189._0_16_ = ZEXT116(0) * auVar219 + ZEXT116(1) * auVar227;
                  auVar189._16_16_ = ZEXT116(1) * auVar219;
                  auVar139 = vpunpcklwd_avx2(auVar170,auVar189);
                  auVar233._8_8_ = 0;
                  auVar233._0_8_ = av1_filter_8bit[uVar98 + iVar94 >> 10];
                  auVar236._8_8_ = 0;
                  auVar236._0_8_ = av1_filter_8bit[uVar98 + iVar101 >> 10];
                  auVar190._0_16_ = ZEXT116(0) * auVar233 + ZEXT116(1) * auVar236;
                  auVar190._16_16_ = ZEXT116(1) * auVar233;
                  auVar239._8_8_ = 0;
                  auVar239._0_8_ = av1_filter_8bit[uVar98 + iVar83 >> 10];
                  auVar246._8_8_ = 0;
                  auVar246._0_8_ = av1_filter_8bit[uVar98 + iVar79 >> 10];
                  auVar204._0_16_ = ZEXT116(0) * auVar239 + ZEXT116(1) * auVar246;
                  auVar204._16_16_ = ZEXT116(1) * auVar239;
                  auVar253._8_8_ = 0;
                  auVar253._0_8_ = av1_filter_8bit[uVar98 + iVar88 >> 10];
                  auVar259._8_8_ = 0;
                  auVar259._0_8_ = av1_filter_8bit[uVar98 + iVar65 >> 10];
                  auVar214._0_16_ = ZEXT116(0) * auVar253 + ZEXT116(1) * auVar259;
                  auVar214._16_16_ = ZEXT116(1) * auVar253;
                  auVar243 = vpunpcklwd_avx2(auVar190,auVar214);
                  auVar264._8_8_ = 0;
                  auVar264._0_8_ = av1_filter_8bit[uVar98 + iVar37 >> 10];
                  auVar143._8_8_ = 0;
                  auVar143._0_8_ = av1_filter_8bit[uVar98 + iVar104 >> 10];
                  auVar152._0_16_ = ZEXT116(0) * auVar264 + ZEXT116(1) * auVar143;
                  auVar152._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar264;
                  auVar250 = vpunpcklwd_avx2(auVar204,auVar152);
                  auVar179 = vpunpckldq_avx2(auVar178,auVar243);
                  auVar178 = vpunpckhdq_avx2(auVar178,auVar243);
                  auVar243 = vpunpckldq_avx2(auVar139,auVar250);
                  auVar139 = vpunpckhdq_avx2(auVar139,auVar250);
                  auVar250 = vpunpcklqdq_avx2(auVar179,auVar243);
                  auVar179 = vpunpckhqdq_avx2(auVar179,auVar243);
                  auVar112 = vpunpcklqdq_avx2(auVar178,auVar139);
                  auVar111 = vpunpckhqdq_avx2(auVar178,auVar139);
                  auVar243._16_16_ = _DAT_0056c940;
                  auVar243._0_16_ = _DAT_0056c940;
                  auVar178 = vpshufb_avx2(auVar109,auVar243);
                  auVar139 = vpmaddubsw_avx2(auVar178,auVar250);
                  auVar250._16_16_ = _DAT_0056d060;
                  auVar250._0_16_ = _DAT_0056d060;
                  auVar178 = vpshufb_avx2(auVar109,auVar250);
                  auVar178 = vpmaddubsw_avx2(auVar178,auVar179);
                  auVar179._16_16_ = _DAT_0056d070;
                  auVar179._0_16_ = _DAT_0056d070;
                  auVar262 = vpshufb_avx2(auVar109,auVar179);
                  auVar262 = vpmaddubsw_avx2(auVar262,auVar112);
                  auVar178 = vpaddw_avx2(auVar178,auVar262);
                  auVar262._16_16_ = _DAT_0056d080;
                  auVar262._0_16_ = _DAT_0056d080;
                  auVar112 = vpshufb_avx2(auVar109,auVar262);
                  auVar112 = vpmaddubsw_avx2(auVar112,auVar111);
                  auVar139 = vpaddw_avx2(auVar238,auVar139);
                  auVar178 = vpaddw_avx2(auVar139,auVar178);
                  auVar178 = vpaddw_avx2(auVar178,auVar112);
                  auVar178 = vpsrlw_avx2(auVar178,auVar232);
                  *pauVar59 = auVar178;
                  iVar74 = iVar74 + 2;
                  pauVar59 = pauVar59 + 1;
                  iVar37 = iVar37 + iVar13;
                  iVar88 = iVar88 + iVar13;
                  iVar83 = iVar83 + iVar13;
                  iVar94 = iVar94 + iVar13;
                  iVar90 = iVar90 + iVar13;
                  iVar91 = iVar91 + iVar13;
                  iVar95 = iVar95 + iVar13;
                  iVar38 = iVar38 + iVar13;
                  iVar104 = iVar104 + iVar13;
                  iVar65 = iVar65 + iVar13;
                  iVar79 = iVar79 + iVar13;
                  iVar101 = iVar101 + iVar13;
                  uVar69 = uVar69 + iVar13;
                  uVar84 = uVar84 + iVar13;
                  uVar99 = uVar99 + iVar13;
                  iVar36 = iVar36 + iVar13;
                  lVar93 = lVar93 + -1;
                  auVar127 = auVar232;
                } while (lVar93 != 0);
              }
              iVar51 = iVar74 + iVar51;
              iVar36 = iVar1;
              if (iVar51 < iVar1) {
                iVar36 = iVar51;
              }
              if (iVar51 < 0) {
                iVar36 = 0;
              }
              auVar108 = *(undefined1 (*) [16])
                          (ref + (long)(int)uVar63 + -7 + (long)(iVar36 * stride));
              if ((int)uVar63 < 7) {
                auVar108 = vpshufb_avx(auVar108,(undefined1  [16])warp_pad_left[6 - uVar63]);
              }
              if (-1 < (int)uVar52) {
                auVar108 = vpshufb_avx(auVar108,(undefined1  [16])warp_pad_right[uVar52]);
              }
              iVar51 = (iVar74 + 4) * iVar68 + uVar82;
              auVar110._0_16_ = ZEXT116(0) * auVar108 + ZEXT116(1) * auVar108;
              auVar110._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar108;
              auVar123._8_8_ = 0;
              auVar123._0_8_ = av1_filter_8bit[iVar51 >> 10];
              auVar162._8_8_ = 0;
              auVar162._0_8_ = av1_filter_8bit[iVar12 + iVar51 >> 10];
              auVar108 = vpunpcklwd_avx(auVar123,auVar162);
              auVar144._8_8_ = 0;
              auVar144._0_8_ = av1_filter_8bit[iVar86 + iVar51 >> 10];
              auVar163._8_8_ = 0;
              auVar163._0_8_ = av1_filter_8bit[iVar7 + iVar51 >> 10];
              auVar124 = vpunpcklwd_avx(auVar144,auVar163);
              auVar164._8_8_ = 0;
              auVar164._0_8_ = av1_filter_8bit[iVar60 + iVar51 >> 10];
              auVar198._8_8_ = 0;
              auVar198._0_8_ = av1_filter_8bit[iVar5 + iVar51 >> 10];
              auVar145 = vpunpcklwd_avx(auVar164,auVar198);
              auVar184._8_8_ = 0;
              auVar184._0_8_ = av1_filter_8bit[iVar6 + iVar51 >> 10];
              auVar199._8_8_ = 0;
              auVar199._0_8_ = av1_filter_8bit[iVar51 + iVar4 >> 10];
              auVar165 = vpunpcklwd_avx(auVar184,auVar199);
              auVar185 = vpunpckldq_avx(auVar108,auVar145);
              auVar108 = vpunpckhdq_avx(auVar108,auVar145);
              auVar145 = vpunpckldq_avx(auVar124,auVar165);
              auVar124 = vpunpckhdq_avx(auVar124,auVar165);
              auVar165 = vpunpcklqdq_avx(auVar185,auVar145);
              auVar191._0_16_ = ZEXT116(0) * auVar110._0_16_ + ZEXT116(1) * auVar165;
              auVar191._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110._0_16_;
              auVar145 = vpunpckhqdq_avx(auVar185,auVar145);
              auVar171._0_16_ = ZEXT116(0) * auVar110._0_16_ + ZEXT116(1) * auVar145;
              auVar171._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110._0_16_;
              auVar145 = vpunpcklqdq_avx(auVar108,auVar124);
              auVar205._0_16_ = ZEXT116(0) * auVar110._0_16_ + ZEXT116(1) * auVar145;
              auVar205._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110._0_16_;
              auVar108 = vpunpckhqdq_avx(auVar108,auVar124);
              auVar132._0_16_ = ZEXT116(0) * auVar110._0_16_ + ZEXT116(1) * auVar108;
              auVar132._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110._0_16_;
              auVar178 = vpshufb_avx2(auVar110,auVar243);
              auVar139 = vpmaddubsw_avx2(auVar178,auVar191);
              auVar178 = vpshufb_avx2(auVar110,auVar250);
              auVar178 = vpmaddubsw_avx2(auVar178,auVar171);
              auVar243 = vpshufb_avx2(auVar110,auVar179);
              auVar243 = vpmaddubsw_avx2(auVar243,auVar205);
              auVar178 = vpaddw_avx2(auVar178,auVar243);
              auVar243 = vpshufb_avx2(auVar110,auVar262);
              auVar243 = vpmaddubsw_avx2(auVar243,auVar132);
              auVar139 = vpaddw_avx2(auVar238,auVar139);
              auVar178 = vpaddw_avx2(auVar139,auVar178);
              auVar178 = vpaddw_avx2(auVar178,auVar243);
            }
            else {
              uVar42 = uVar57;
              if (beta == 0 && alpha == 0) {
                local_550 = (ulong)(uVar63 & 0x7fffffff);
                auVar112 = vpermq_avx2(ZEXT832((ulong)av1_filter_8bit[uVar82 >> 10]),0x44);
                auVar111._0_2_ = SUB82(av1_filter_8bit[uVar82 >> 10],0);
                auVar111._2_2_ = auVar111._0_2_;
                auVar111._4_2_ = auVar111._0_2_;
                auVar111._6_2_ = auVar111._0_2_;
                auVar111._8_2_ = auVar111._0_2_;
                auVar111._10_2_ = auVar111._0_2_;
                auVar111._12_2_ = auVar111._0_2_;
                auVar111._14_2_ = auVar111._0_2_;
                auVar111._16_2_ = auVar111._0_2_;
                auVar111._18_2_ = auVar111._0_2_;
                auVar111._20_2_ = auVar111._0_2_;
                auVar111._22_2_ = auVar111._0_2_;
                auVar111._24_2_ = auVar111._0_2_;
                auVar111._26_2_ = auVar111._0_2_;
                auVar111._28_2_ = auVar111._0_2_;
                auVar111._30_2_ = auVar111._0_2_;
                auVar178 = vpshuflw_avx2(auVar112,0x55);
                auVar178 = vpshufd_avx2(auVar178,0);
                auVar139 = vpshuflw_avx2(auVar112,0xaa);
                auVar139 = vpshufd_avx2(auVar139,0);
                auVar112 = vpshuflw_avx2(auVar112,0xff);
                auVar112 = vpshufd_avx2(auVar112,0);
                if (lVar40 < -5) {
LAB_004661d2:
                  iVar36 = -7;
                  uVar42 = 0;
                }
                else {
                  iVar79 = iVar51 + -7;
                  iVar65 = iVar51 + -6;
                  iVar36 = 7;
                  lVar100 = 0;
                  do {
                    iVar91 = iVar1;
                    if (iVar79 < iVar1) {
                      iVar91 = iVar79;
                    }
                    if (iVar79 < 0) {
                      iVar91 = 0;
                    }
                    iVar95 = iVar1;
                    if (iVar65 < iVar1) {
                      iVar95 = iVar65;
                    }
                    if (iVar79 < -1) {
                      iVar95 = 0;
                    }
                    auVar172._0_16_ =
                         ZEXT116(0) *
                         *(undefined1 (*) [16])(ref + (long)(iVar95 * stride) + (local_550 - 7)) +
                         ZEXT116(1) *
                         *(undefined1 (*) [16])(ref + (long)(iVar91 * stride) + (local_550 - 7));
                    auVar172._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                         ZEXT116(1) *
                         *(undefined1 (*) [16])(ref + (long)(iVar95 * stride) + (local_550 - 7));
                    auVar113 = vpshufb_avx2(auVar172,auVar243);
                    auVar133 = vpshufb_avx2(auVar172,auVar250);
                    auVar153 = vpshufb_avx2(auVar172,auVar179);
                    auVar174 = vpshufb_avx2(auVar172,auVar262);
                    auVar172 = vpmaddubsw_avx2(auVar113,auVar111);
                    auVar113 = vpmaddubsw_avx2(auVar133,auVar178);
                    auVar133 = vpmaddubsw_avx2(auVar153,auVar139);
                    auVar113 = vpaddw_avx2(auVar113,auVar133);
                    auVar133 = vpmaddubsw_avx2(auVar174,auVar112);
                    auVar172 = vpaddw_avx2(auVar238,auVar172);
                    auVar113 = vpaddw_avx2(auVar172,auVar113);
                    auVar113 = vpaddw_avx2(auVar113,auVar133);
                    auVar113 = vpsrlw_avx2(auVar113,auVar127);
                    *(undefined1 (*) [32])(local_160 + lVar100 * 2) = auVar113;
                    lVar100 = lVar100 + 0x10;
                    iVar36 = iVar36 + -2;
                    iVar79 = iVar79 + 2;
                    iVar65 = iVar65 + 2;
                  } while (lVar67 != lVar100);
LAB_004665f4:
                  iVar36 = -iVar36;
                }
                iVar36 = iVar36 + iVar51;
                iVar51 = iVar1;
                if (iVar36 < iVar1) {
                  iVar51 = iVar36;
                }
                if (iVar36 < 0) {
                  iVar51 = 0;
                }
                auVar175._0_16_ =
                     ZEXT116(0) * auVar111._0_16_ +
                     ZEXT116(1) *
                     *(undefined1 (*) [16])(ref + (local_550 - 7) + (long)(iVar51 * stride));
                auVar175._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar111._0_16_;
                auVar243 = vpshufb_avx2(auVar175,auVar243);
                auVar250 = vpshufb_avx2(auVar175,auVar250);
                auVar179 = vpshufb_avx2(auVar175,auVar179);
                auVar262 = vpshufb_avx2(auVar175,auVar262);
                auVar243 = vpmaddubsw_avx2(auVar243,auVar111);
                auVar178 = vpmaddubsw_avx2(auVar250,auVar178);
                auVar139 = vpmaddubsw_avx2(auVar179,auVar139);
                auVar250 = vpmaddubsw_avx2(auVar262,auVar112);
              }
              else if (alpha != 0 || beta == 0) {
                if (alpha != 0 && beta == 0) {
                  auVar108._8_8_ = 0;
                  auVar108._0_8_ = av1_filter_8bit[(int)uVar82 >> 10];
                  auVar145._8_8_ = 0;
                  auVar145._0_8_ = av1_filter_8bit[(int)(iVar12 + uVar82) >> 10];
                  auVar108 = vpunpcklwd_avx(auVar108,auVar145);
                  auVar124._8_8_ = 0;
                  auVar124._0_8_ = av1_filter_8bit[(int)(iVar86 + uVar82) >> 10];
                  auVar165._8_8_ = 0;
                  auVar165._0_8_ = av1_filter_8bit[(int)(iVar7 + uVar82) >> 10];
                  auVar124 = vpunpcklwd_avx(auVar124,auVar165);
                  auVar185._8_8_ = 0;
                  auVar185._0_8_ = av1_filter_8bit[(int)(iVar60 + uVar82) >> 10];
                  auVar210._8_8_ = 0;
                  auVar210._0_8_ = av1_filter_8bit[(int)(iVar5 + uVar82) >> 10];
                  auVar145 = vpunpcklwd_avx(auVar185,auVar210);
                  local_550 = (ulong)(uVar63 & 0x7fffffff);
                  auVar200._8_8_ = 0;
                  auVar200._0_8_ = av1_filter_8bit[(int)(iVar6 + uVar82) >> 10];
                  auVar220._8_8_ = 0;
                  auVar220._0_8_ = av1_filter_8bit[(int)(uVar82 + iVar4) >> 10];
                  auVar165 = vpunpcklwd_avx(auVar200,auVar220);
                  auVar112._0_16_ = ZEXT116(0) * auVar108 + ZEXT116(1) * auVar108;
                  auVar112._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar108;
                  auVar153._0_16_ = ZEXT116(0) * auVar145 + ZEXT116(1) * auVar145;
                  auVar153._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar145;
                  auVar178 = vpunpckldq_avx2(auVar112,auVar153);
                  auVar112 = vpunpckhdq_avx2(auVar112,auVar153);
                  auVar113._0_16_ = ZEXT116(0) * auVar124 + ZEXT116(1) * auVar124;
                  auVar113._16_16_ = ZEXT116(1) * auVar124;
                  auVar133._0_16_ = ZEXT116(0) * auVar165 + ZEXT116(1) * auVar165;
                  auVar133._16_16_ = ZEXT116(1) * auVar165;
                  auVar139 = vpunpckldq_avx2(auVar113,auVar133);
                  auVar113 = vpunpckhdq_avx2(auVar113,auVar133);
                  auVar111 = vpunpcklqdq_avx2(auVar178,auVar139);
                  auVar178 = vpunpckhqdq_avx2(auVar178,auVar139);
                  auVar139 = vpunpcklqdq_avx2(auVar112,auVar113);
                  auVar112 = vpunpckhqdq_avx2(auVar112,auVar113);
                  if (-6 < lVar40) {
                    iVar79 = iVar51 + -7;
                    iVar65 = iVar51 + -6;
                    iVar36 = 7;
                    lVar100 = 0;
                    do {
                      iVar91 = iVar1;
                      if (iVar79 < iVar1) {
                        iVar91 = iVar79;
                      }
                      if (iVar79 < 0) {
                        iVar91 = 0;
                      }
                      iVar95 = iVar1;
                      if (iVar65 < iVar1) {
                        iVar95 = iVar65;
                      }
                      if (iVar79 < -1) {
                        iVar95 = 0;
                      }
                      auVar174._0_16_ =
                           ZEXT116(0) *
                           *(undefined1 (*) [16])(ref + (long)(iVar95 * stride) + (local_550 - 7)) +
                           ZEXT116(1) *
                           *(undefined1 (*) [16])(ref + (long)(iVar91 * stride) + (local_550 - 7));
                      auVar174._16_16_ =
                           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                           ZEXT116(1) *
                           *(undefined1 (*) [16])(ref + (long)(iVar95 * stride) + (local_550 - 7));
                      auVar113 = vpshufb_avx2(auVar174,auVar243);
                      auVar133 = vpshufb_avx2(auVar174,auVar250);
                      auVar153 = vpshufb_avx2(auVar174,auVar179);
                      auVar174 = vpshufb_avx2(auVar174,auVar262);
                      auVar172 = vpmaddubsw_avx2(auVar113,auVar111);
                      auVar113 = vpmaddubsw_avx2(auVar133,auVar178);
                      auVar133 = vpmaddubsw_avx2(auVar153,auVar139);
                      auVar113 = vpaddw_avx2(auVar113,auVar133);
                      auVar133 = vpmaddubsw_avx2(auVar174,auVar112);
                      auVar172 = vpaddw_avx2(auVar238,auVar172);
                      auVar113 = vpaddw_avx2(auVar172,auVar113);
                      auVar113 = vpaddw_avx2(auVar113,auVar133);
                      auVar113 = vpsrlw_avx2(auVar113,auVar127);
                      *(undefined1 (*) [32])(local_160 + lVar100 * 2) = auVar113;
                      lVar100 = lVar100 + 0x10;
                      iVar36 = iVar36 + -2;
                      iVar79 = iVar79 + 2;
                      iVar65 = iVar65 + 2;
                    } while (lVar67 != lVar100);
                    goto LAB_004665f4;
                  }
                  goto LAB_004661d2;
                }
                if (lVar40 < -5) {
                  local_560 = -7;
                  uVar42 = 0;
                }
                else {
                  lVar100 = (ulong)(uVar63 & 0x7fffffff) - 7;
                  local_560 = -7;
                  local_490._4_4_ = 0;
                  local_490._0_4_ = uVar49;
                  local_490._8_8_ = auVar108._8_8_;
                  local_2e0._4_4_ = 0;
                  local_2e0._0_4_ = uVar48;
                  local_2e0._8_24_ = auVar139._8_24_;
                  local_300._4_4_ = 0;
                  local_300._0_4_ = uVar47;
                  local_300._8_24_ = auVar178._8_24_;
                  local_460 = &local_160;
                  lVar93 = uVar55 + 1;
                  iVar36 = iVar50;
                  iVar79 = iVar46;
                  iVar65 = iVar45;
                  iVar91 = iVar44;
                  iVar95 = iVar96;
                  iVar101 = iVar61;
                  iVar104 = iVar72;
                  iVar90 = iVar75;
                  iVar94 = iVar78;
                  iVar83 = iVar102;
                  iVar88 = iVar97;
                  iVar37 = iVar87;
                  iVar38 = iVar62;
                  do {
                    auVar139 = local_2e0._0_32_;
                    auVar178 = local_300;
                    auVar108 = local_490;
                    iVar92 = iVar51 + local_560;
                    iVar74 = iVar1;
                    if (iVar92 < iVar1) {
                      iVar74 = iVar92;
                    }
                    if (iVar92 < 0) {
                      iVar74 = 0;
                    }
                    iVar76 = iVar51 + local_560 + 1;
                    if (iVar1 <= iVar76) {
                      iVar76 = iVar1;
                    }
                    if (iVar92 < -1) {
                      iVar76 = 0;
                    }
                    auVar116._0_16_ =
                         ZEXT116(0) * *(undefined1 (*) [16])(ref + iVar76 * stride + lVar100) +
                         ZEXT116(1) * *(undefined1 (*) [16])(ref + iVar74 * stride + lVar100);
                    auVar116._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                         ZEXT116(1) * *(undefined1 (*) [16])(ref + iVar76 * stride + lVar100);
                    iVar74 = local_490._0_4_;
                    iVar92 = local_2e0._0_4_;
                    iVar76 = local_300._0_4_;
                    auVar127._8_8_ = 0;
                    auVar127._0_8_ = av1_filter_8bit[iVar38 + uVar98 >> 10];
                    auVar147._8_8_ = 0;
                    auVar147._0_8_ = av1_filter_8bit[iVar36 + uVar98 >> 10];
                    auVar135._0_16_ = ZEXT116(0) * auVar127 + ZEXT116(1) * auVar147;
                    auVar135._16_16_ = ZEXT116(1) * auVar127;
                    auVar166._8_8_ = 0;
                    auVar166._0_8_ = av1_filter_8bit[iVar37 + uVar98 >> 10];
                    auVar186._8_8_ = 0;
                    auVar186._0_8_ = av1_filter_8bit[iVar74 + uVar98 >> 10];
                    auVar176._0_16_ = ZEXT116(0) * auVar166 + ZEXT116(1) * auVar186;
                    auVar176._16_16_ = ZEXT116(1) * auVar166;
                    auVar201._8_8_ = 0;
                    auVar201._0_8_ = av1_filter_8bit[iVar88 + uVar98 >> 10];
                    auVar211._8_8_ = 0;
                    auVar211._0_8_ = av1_filter_8bit[iVar92 + uVar98 >> 10];
                    auVar192._0_16_ = ZEXT116(0) * auVar201 + ZEXT116(1) * auVar211;
                    auVar192._16_16_ = ZEXT116(1) * auVar201;
                    auVar112 = vpunpcklwd_avx2(auVar135,auVar192);
                    auVar221._8_8_ = 0;
                    auVar221._0_8_ = av1_filter_8bit[iVar101 + uVar98 >> 10];
                    auVar228._8_8_ = 0;
                    auVar228._0_8_ = av1_filter_8bit[iVar76 + uVar98 >> 10];
                    auVar193._0_16_ = ZEXT116(0) * auVar221 + ZEXT116(1) * auVar228;
                    auVar193._16_16_ = ZEXT116(1) * auVar221;
                    auVar111 = vpunpcklwd_avx2(auVar176,auVar193);
                    auVar234._8_8_ = 0;
                    auVar234._0_8_ = av1_filter_8bit[iVar104 + uVar98 >> 10];
                    auVar237._8_8_ = 0;
                    auVar237._0_8_ = av1_filter_8bit[iVar79 + uVar98 >> 10];
                    auVar194._0_16_ = ZEXT116(0) * auVar234 + ZEXT116(1) * auVar237;
                    auVar194._16_16_ = ZEXT116(1) * auVar234;
                    auVar240._8_8_ = 0;
                    auVar240._0_8_ = av1_filter_8bit[iVar90 + uVar98 >> 10];
                    auVar247._8_8_ = 0;
                    auVar247._0_8_ = av1_filter_8bit[iVar65 + uVar98 >> 10];
                    auVar206._0_16_ = ZEXT116(0) * auVar240 + ZEXT116(1) * auVar247;
                    auVar206._16_16_ = ZEXT116(1) * auVar240;
                    auVar250._16_16_ = _DAT_0056d060;
                    auVar250._0_16_ = _DAT_0056d060;
                    auVar243._16_16_ = _DAT_0056c940;
                    auVar243._0_16_ = _DAT_0056c940;
                    auVar254._8_8_ = 0;
                    auVar254._0_8_ = av1_filter_8bit[iVar94 + uVar98 >> 10];
                    auVar260._8_8_ = 0;
                    auVar260._0_8_ = av1_filter_8bit[iVar91 + uVar98 >> 10];
                    auVar215._0_16_ = ZEXT116(0) * auVar254 + ZEXT116(1) * auVar260;
                    auVar215._16_16_ = ZEXT116(1) * auVar254;
                    auVar262._16_16_ = _DAT_0056d080;
                    auVar262._0_16_ = _DAT_0056d080;
                    auVar179._16_16_ = _DAT_0056d070;
                    auVar179._0_16_ = _DAT_0056d070;
                    auVar113 = vpunpcklwd_avx2(auVar194,auVar215);
                    auVar265._8_8_ = 0;
                    auVar265._0_8_ = av1_filter_8bit[iVar83 + uVar98 >> 10];
                    auVar148._8_8_ = 0;
                    auVar148._0_8_ = av1_filter_8bit[iVar95 + uVar98 >> 10];
                    auVar154._0_16_ = ZEXT116(0) * auVar265 + ZEXT116(1) * auVar148;
                    auVar154._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar265;
                    auVar172 = vpunpcklwd_avx2(auVar206,auVar154);
                    auVar133 = vpunpckldq_avx2(auVar112,auVar113);
                    auVar112 = vpunpckhdq_avx2(auVar112,auVar113);
                    auVar113 = vpunpckldq_avx2(auVar111,auVar172);
                    auVar111 = vpunpckhdq_avx2(auVar111,auVar172);
                    auVar153 = vpunpcklqdq_avx2(auVar133,auVar113);
                    auVar113 = vpunpckhqdq_avx2(auVar133,auVar113);
                    auVar133 = vpunpcklqdq_avx2(auVar112,auVar111);
                    auVar172 = vpunpckhqdq_avx2(auVar112,auVar111);
                    auVar112 = vpshufb_avx2(auVar116,auVar243);
                    auVar111 = vpmaddubsw_avx2(auVar112,auVar153);
                    auVar112 = vpshufb_avx2(auVar116,auVar250);
                    auVar112 = vpmaddubsw_avx2(auVar112,auVar113);
                    auVar113 = vpshufb_avx2(auVar116,auVar179);
                    auVar113 = vpmaddubsw_avx2(auVar113,auVar133);
                    auVar112 = vpaddw_avx2(auVar112,auVar113);
                    auVar113 = vpshufb_avx2(auVar116,auVar262);
                    auVar113 = vpmaddubsw_avx2(auVar113,auVar172);
                    auVar111 = vpaddw_avx2(auVar238,auVar111);
                    auVar112 = vpaddw_avx2(auVar111,auVar112);
                    auVar112 = vpaddw_avx2(auVar112,auVar113);
                    auVar112 = vpsrlw_avx2(auVar112,auVar232);
                    *local_460 = auVar112;
                    local_560 = local_560 + 2;
                    local_460 = local_460 + 1;
                    iVar83 = iVar83 + iVar13;
                    iVar94 = iVar94 + iVar13;
                    iVar90 = iVar90 + iVar13;
                    iVar104 = iVar104 + iVar13;
                    iVar101 = iVar101 + iVar13;
                    iVar88 = iVar88 + iVar13;
                    iVar37 = iVar37 + iVar13;
                    iVar38 = iVar38 + iVar13;
                    iVar95 = iVar95 + iVar13;
                    iVar91 = iVar91 + iVar13;
                    iVar65 = iVar65 + iVar13;
                    iVar79 = iVar79 + iVar13;
                    local_300._4_4_ = 0;
                    local_300._0_4_ = iVar76 + iVar13;
                    local_300._8_24_ = auVar178._8_24_;
                    local_2e0._4_4_ = 0;
                    local_2e0._0_4_ = iVar92 + iVar13;
                    local_2e0._8_24_ = auVar139._8_24_;
                    local_490._4_4_ = 0;
                    local_490._0_4_ = iVar74 + iVar13;
                    local_490._8_8_ = auVar108._8_8_;
                    iVar36 = iVar36 + iVar13;
                    lVar93 = lVar93 + -1;
                    auVar127 = auVar232;
                  } while (lVar93 != 0);
                }
                iVar51 = local_560 + iVar51;
                iVar36 = iVar1;
                if (iVar51 < iVar1) {
                  iVar36 = iVar51;
                }
                if (iVar51 < 0) {
                  iVar36 = 0;
                }
                auVar108 = *(undefined1 (*) [16])
                            (ref + ((ulong)(uVar63 & 0x7fffffff) - 7) + (long)(iVar36 * stride));
                iVar51 = (local_560 + 4) * iVar68 + uVar82;
                auVar128._8_8_ = 0;
                auVar128._0_8_ = av1_filter_8bit[iVar51 >> 10];
                auVar167._8_8_ = 0;
                auVar167._0_8_ = av1_filter_8bit[iVar12 + iVar51 >> 10];
                auVar124 = vpunpcklwd_avx(auVar128,auVar167);
                auVar149._8_8_ = 0;
                auVar149._0_8_ = av1_filter_8bit[iVar86 + iVar51 >> 10];
                auVar187._8_8_ = 0;
                auVar187._0_8_ = av1_filter_8bit[iVar7 + iVar51 >> 10];
                auVar145 = vpunpcklwd_avx(auVar149,auVar187);
                auVar202._8_8_ = 0;
                auVar202._0_8_ = av1_filter_8bit[iVar60 + iVar51 >> 10];
                auVar222._8_8_ = 0;
                auVar222._0_8_ = av1_filter_8bit[iVar5 + iVar51 >> 10];
                auVar165 = vpunpcklwd_avx(auVar202,auVar222);
                auVar195._0_16_ = ZEXT116(0) * auVar108 + ZEXT116(1) * auVar108;
                auVar195._16_16_ = ZEXT116(1) * auVar108;
                auVar212._8_8_ = 0;
                auVar212._0_8_ = av1_filter_8bit[iVar6 + iVar51 >> 10];
                auVar229._8_8_ = 0;
                auVar229._0_8_ = av1_filter_8bit[iVar51 + iVar4 >> 10];
                auVar185 = vpunpcklwd_avx(auVar212,auVar229);
                auVar200 = vpunpckldq_avx(auVar124,auVar165);
                auVar108 = vpunpckhdq_avx(auVar124,auVar165);
                auVar165 = vpunpckldq_avx(auVar145,auVar185);
                auVar124 = vpunpckhdq_avx(auVar145,auVar185);
                auVar145 = vpunpcklqdq_avx(auVar200,auVar165);
                auVar155._0_16_ = ZEXT116(0) * auVar124 + ZEXT116(1) * auVar145;
                auVar155._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar124;
                auVar145 = vpunpckhqdq_avx(auVar200,auVar165);
                auVar177._0_16_ = ZEXT116(0) * auVar124 + ZEXT116(1) * auVar145;
                auVar177._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar124;
                auVar145 = vpunpcklqdq_avx(auVar108,auVar124);
                auVar207._0_16_ = ZEXT116(0) * auVar124 + ZEXT116(1) * auVar145;
                auVar207._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar124;
                auVar108 = vpunpckhqdq_avx(auVar108,auVar124);
                auVar216._0_16_ = ZEXT116(0) * auVar108 + ZEXT116(1) * auVar108;
                auVar216._16_16_ = ZEXT116(1) * auVar108;
                auVar178 = vpshufb_avx2(auVar195,auVar243);
                auVar243 = vpmaddubsw_avx2(auVar178,auVar155);
                auVar178 = vpshufb_avx2(auVar195,auVar250);
                auVar178 = vpmaddubsw_avx2(auVar178,auVar177);
                auVar139 = vpshufb_avx2(auVar195,auVar179);
                auVar139 = vpmaddubsw_avx2(auVar139,auVar207);
                auVar250 = vpshufb_avx2(auVar195,auVar262);
                auVar250 = vpmaddubsw_avx2(auVar250,auVar216);
              }
              else {
                if (lVar40 < -5) {
                  iVar36 = -7;
                  uVar42 = 0;
                }
                else {
                  lVar100 = (ulong)(uVar63 & 0x7fffffff) - 7;
                  iVar36 = iVar62 + uVar98;
                  iVar79 = uVar98 + iVar50;
                  uVar58 = 0xfffffffffffffffe;
                  pauVar59 = &local_160;
                  do {
                    iVar91 = iVar51 + (int)uVar58 + -5;
                    iVar65 = iVar1;
                    if (iVar91 < iVar1) {
                      iVar65 = iVar91;
                    }
                    if (iVar91 < 0) {
                      iVar65 = 0;
                    }
                    iVar95 = iVar51 + (int)uVar58 + -4;
                    if (iVar1 <= iVar95) {
                      iVar95 = iVar1;
                    }
                    if (iVar91 < -1) {
                      iVar95 = 0;
                    }
                    auVar114._0_16_ =
                         ZEXT116(0) * *(undefined1 (*) [16])(ref + iVar95 * stride + lVar100) +
                         ZEXT116(1) * *(undefined1 (*) [16])(ref + iVar65 * stride + lVar100);
                    auVar114._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                         ZEXT116(1) * *(undefined1 (*) [16])(ref + iVar95 * stride + lVar100);
                    auVar146._8_8_ = 0;
                    auVar146._0_8_ = av1_filter_8bit[iVar36 >> 10];
                    auVar125._8_8_ = 0;
                    auVar125._0_8_ = av1_filter_8bit[iVar79 >> 10];
                    auVar134._0_16_ = ZEXT116(0) * auVar146 + ZEXT116(1) * auVar125;
                    auVar134._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar146;
                    auVar178 = vpshuflw_avx2(auVar134,0);
                    auVar139 = vpshufd_avx2(auVar178,0);
                    auVar178 = vpshuflw_avx2(auVar134,0x55);
                    auVar112 = vpshufd_avx2(auVar178,0);
                    auVar178 = vpshuflw_avx2(auVar134,0xaa);
                    auVar111 = vpshufd_avx2(auVar178,0);
                    auVar178 = vpshuflw_avx2(auVar134,0xff);
                    auVar113 = vpshufd_avx2(auVar178,0);
                    auVar178 = vpshufb_avx2(auVar114,auVar243);
                    auVar139 = vpmaddubsw_avx2(auVar178,auVar139);
                    auVar178 = vpshufb_avx2(auVar114,auVar250);
                    auVar178 = vpmaddubsw_avx2(auVar178,auVar112);
                    auVar112 = vpshufb_avx2(auVar114,auVar179);
                    auVar112 = vpmaddubsw_avx2(auVar112,auVar111);
                    auVar178 = vpaddw_avx2(auVar178,auVar112);
                    auVar112 = vpshufb_avx2(auVar114,auVar262);
                    auVar112 = vpmaddubsw_avx2(auVar112,auVar113);
                    auVar139 = vpaddw_avx2(auVar238,auVar139);
                    auVar178 = vpaddw_avx2(auVar139,auVar178);
                    auVar178 = vpaddw_avx2(auVar178,auVar112);
                    auVar178 = vpsrlw_avx2(auVar178,auVar127);
                    *pauVar59 = auVar178;
                    uVar58 = uVar58 + 2;
                    pauVar59 = pauVar59 + 1;
                    iVar36 = iVar36 + iVar13;
                    iVar79 = iVar79 + iVar13;
                  } while ((uVar73 + 5 & 0xfffffffe) != uVar58);
                  iVar36 = (int)uVar58 + -5;
                }
                iVar51 = iVar36 + iVar51;
                iVar79 = iVar1;
                if (iVar51 < iVar1) {
                  iVar79 = iVar51;
                }
                if (iVar51 < 0) {
                  iVar79 = 0;
                }
                auVar108 = *(undefined1 (*) [16])
                            (ref + ((ulong)(uVar63 & 0x7fffffff) - 7) + (long)(iVar79 * stride));
                auVar173._0_16_ = ZEXT116(0) * auVar108 + ZEXT116(1) * auVar108;
                auVar173._16_16_ = ZEXT116(1) * auVar108;
                iVar51 = (iVar36 + 4) * iVar68 + uVar82;
                auVar126._8_8_ = 0;
                auVar126._0_8_ = av1_filter_8bit[iVar51 + iVar68 >> 10];
                auVar107._8_8_ = 0;
                auVar107._0_8_ = av1_filter_8bit[iVar51 >> 10];
                auVar115._0_16_ = ZEXT116(0) * auVar126 + ZEXT116(1) * auVar107;
                auVar115._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar126;
                auVar178 = vpshuflw_avx2(auVar115,0);
                auVar139 = vpshufd_avx2(auVar178,0);
                auVar178 = vpshuflw_avx2(auVar115,0x55);
                auVar112 = vpshufd_avx2(auVar178,0);
                auVar178 = vpshuflw_avx2(auVar115,0xaa);
                auVar111 = vpshufd_avx2(auVar178,0);
                auVar178 = vpshuflw_avx2(auVar115,0xff);
                auVar113 = vpshufd_avx2(auVar178,0);
                auVar178 = vpshufb_avx2(auVar173,auVar243);
                auVar243 = vpmaddubsw_avx2(auVar178,auVar139);
                auVar178 = vpshufb_avx2(auVar173,auVar250);
                auVar178 = vpmaddubsw_avx2(auVar178,auVar112);
                auVar139 = vpshufb_avx2(auVar173,auVar179);
                auVar139 = vpmaddubsw_avx2(auVar139,auVar111);
                auVar250 = vpshufb_avx2(auVar173,auVar262);
                auVar250 = vpmaddubsw_avx2(auVar250,auVar113);
              }
              auVar178 = vpaddw_avx2(auVar178,auVar139);
              auVar139 = vpaddw_avx2(auVar238,auVar243);
              auVar178 = vpaddw_avx2(auVar139,auVar178);
              auVar178 = vpaddw_avx2(auVar178,auVar250);
            }
            auVar178 = vpsrlw_avx2(auVar178,auVar127);
            *(undefined1 (*) [32])(local_160 + uVar42 * 0x20) = auVar178;
          }
          iVar51 = (((uint)lVar41 & 0xfffc) + (iVar89 + iVar81) * -4 & 0xffffffc0) + 0x10200;
          auVar108 = ZEXT416(uVar33);
          auVar127 = ZEXT416(uVar77);
          if (gamma == 0 && delta == 0) {
            if (0 < lVar40) {
              aWVar2 = av1_warped_filter[iVar51 >> 10];
              auVar117._16_2_ = aWVar2[0];
              auVar117._18_2_ = aWVar2[1];
              auVar117._20_2_ = aWVar2[2];
              auVar117._22_2_ = aWVar2[3];
              auVar117._24_2_ = aWVar2[4];
              auVar117._26_2_ = aWVar2[5];
              auVar117._28_2_ = aWVar2[6];
              auVar117._30_2_ = aWVar2[7];
              auVar117._0_2_ = aWVar2[0];
              auVar117._2_2_ = aWVar2[1];
              auVar117._4_2_ = aWVar2[2];
              auVar117._6_2_ = aWVar2[3];
              auVar117._8_2_ = aWVar2[4];
              auVar117._10_2_ = aWVar2[5];
              auVar117._12_2_ = aWVar2[6];
              auVar117._14_2_ = aWVar2[7];
              auVar178 = vpshufd_avx2(auVar117,0);
              auVar139 = vpshufd_avx2(auVar117,0x55);
              auVar243 = vpshufd_avx2(auVar117,0xaa);
              auVar250 = vpshufd_avx2(auVar117,0xff);
              auVar111 = vperm2i128_avx2(local_120,local_100,0x21);
              auVar112 = vpunpckhwd_avx2(local_120,auVar111);
              auVar113 = vperm2i128_avx2(local_140,local_120,0x21);
              auVar179 = vpunpckhwd_avx2(local_140,auVar113);
              auVar133 = vperm2i128_avx2(local_160,local_140,0x21);
              auVar262 = vpunpckhwd_avx2(local_160,auVar133);
              auVar172 = vpunpcklwd_avx2(local_120,auVar111);
              auVar111 = vpunpcklwd_avx2(local_140,auVar113);
              auVar113 = vpunpcklwd_avx2(local_160,auVar133);
              uVar42 = 0xfffffffffffffffe;
              pauVar59 = (undefined1 (*) [32])local_e0;
              lVar41 = 0;
              do {
                auVar175 = auVar179;
                auVar179 = pauVar59[-1];
                auVar174 = vperm2i128_avx2(auVar179,*pauVar59,0x21);
                auVar153 = vpunpcklwd_avx2(auVar179,auVar174);
                auVar113 = vpmaddwd_avx2(auVar113,auVar178);
                auVar133 = vpmaddwd_avx2(auVar111,auVar139);
                auVar113 = vpaddd_avx2(auVar133,auVar113);
                auVar133 = vpmaddwd_avx2(auVar172,auVar243);
                auVar113 = vpaddd_avx2(auVar113,auVar133);
                auVar133 = vpmaddwd_avx2(auVar250,auVar153);
                auVar113 = vpaddd_avx2(auVar113,auVar133);
                auVar133 = vpunpckhwd_avx2(auVar179,auVar174);
                auVar179 = vpmaddwd_avx2(auVar262,auVar178);
                auVar262 = vpmaddwd_avx2(auVar175,auVar139);
                auVar179 = vpaddd_avx2(auVar262,auVar179);
                auVar262 = vpmaddwd_avx2(auVar112,auVar243);
                auVar179 = vpaddd_avx2(auVar262,auVar179);
                auVar262 = vpmaddwd_avx2(auVar250,auVar133);
                auVar179 = vpaddd_avx2(auVar262,auVar179);
                auVar174 = vpunpckldq_avx2(auVar113,auVar179);
                auVar262 = vpunpckhdq_avx2(auVar113,auVar179);
                auVar15._4_4_ = iVar85;
                auVar15._0_4_ = iVar85;
                auVar15._8_4_ = iVar85;
                auVar15._12_4_ = iVar85;
                auVar15._16_4_ = iVar85;
                auVar15._20_4_ = iVar85;
                auVar15._24_4_ = iVar85;
                auVar15._28_4_ = iVar85;
                auVar179 = vpaddd_avx2(auVar174,auVar15);
                if (conv_params->is_compound == 0) {
                  auVar113 = vpsrad_avx2(auVar179,auVar127);
                  auVar179 = vpaddd_avx2(auVar262,auVar15);
                  auVar179 = vpsrad_avx2(auVar179,auVar127);
                  auVar179 = vpackssdw_avx2(auVar113,auVar179);
                  auVar179 = vpackuswb_avx2(auVar179,auVar175);
                  if (p_width == 4) {
                    *(int *)(local_588 + lVar41 * 2) = auVar179._0_4_;
                    *(int *)(local_580 + lVar41 * 2) = auVar179._16_4_;
                  }
                  else {
                    *(long *)(local_588 + lVar41 * 2) = auVar179._0_8_;
                    *(long *)(local_580 + lVar41 * 2) = auVar179._16_8_;
                  }
                }
                else {
                  iVar51 = iVar64 + (int)uVar42 + 2;
                  lVar100 = (long)(iVar51 * conv_params->dst_stride);
                  pCVar3 = conv_params->dst;
                  iVar36 = iVar64 + (int)uVar42 + 3;
                  auVar179 = vpsrad_avx2(auVar179,auVar127);
                  lVar93 = (long)(iVar36 * conv_params->dst_stride);
                  auVar179 = vpackusdw_avx2(auVar179,auVar179);
                  if (conv_params->do_average == 0) {
                    *(long *)(pCVar3 + lVar70 + lVar100) = auVar179._0_8_;
                    *(long *)(pCVar3 + lVar70 + lVar93) = auVar179._16_8_;
                  }
                  else {
                    auVar261._8_8_ = 0;
                    auVar261._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar93);
                    auVar255._8_8_ = 0;
                    auVar255._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar100);
                    auVar257._0_16_ = ZEXT116(0) * auVar261 + ZEXT116(1) * auVar255;
                    auVar257._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar261;
                    if (conv_params->use_dist_wtd_comp_avg == 0) {
                      auVar179 = vpaddw_avx2(auVar257,auVar179);
                      auVar179 = vpsraw_avx2(auVar179,1);
                    }
                    else {
                      auVar179 = vpunpcklwd_avx2(auVar257,auVar179);
                      auVar179 = vpmaddwd_avx2(auVar179,auVar169);
                      auVar179 = vpsrad_avx2(auVar179,4);
                      auVar179 = vpackusdw_avx2(auVar179,auVar179);
                    }
                    auVar23._2_2_ = sVar121;
                    auVar23._0_2_ = sVar121;
                    auVar23._4_2_ = sVar121;
                    auVar23._6_2_ = sVar121;
                    auVar23._8_2_ = sVar121;
                    auVar23._10_2_ = sVar121;
                    auVar23._12_2_ = sVar121;
                    auVar23._14_2_ = sVar121;
                    auVar23._16_2_ = sVar121;
                    auVar23._18_2_ = sVar121;
                    auVar23._20_2_ = sVar121;
                    auVar23._22_2_ = sVar121;
                    auVar23._24_2_ = sVar121;
                    auVar23._26_2_ = sVar121;
                    auVar23._28_2_ = sVar121;
                    auVar23._30_2_ = sVar121;
                    auVar179 = vpaddw_avx2(auVar179,auVar23);
                    auVar179 = vpsraw_avx2(auVar179,auVar108);
                    auVar179 = vpackuswb_avx2(auVar179,auVar179);
                    *(int *)(local_588 + lVar41 * 2) = auVar179._0_4_;
                    *(int *)(local_580 + lVar41 * 2) = auVar179._16_4_;
                  }
                  if (4 < p_width) {
                    lVar100 = (long)(iVar51 * conv_params->dst_stride);
                    lVar93 = (long)(iVar36 * conv_params->dst_stride);
                    auVar179 = vpaddd_avx2(auVar262,auVar15);
                    auVar179 = vpsrad_avx2(auVar179,auVar127);
                    auVar179 = vpackusdw_avx2(auVar179,auVar179);
                    pCVar3 = conv_params->dst;
                    if (conv_params->do_average == 0) {
                      *(long *)(pCVar3 + lVar70 + lVar100 + 4) = auVar179._0_8_;
                      *(long *)(pCVar3 + lVar70 + lVar93 + 4) = auVar179._16_8_;
                    }
                    else {
                      auVar256._8_8_ = 0;
                      auVar256._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar93 + 4);
                      auVar248._8_8_ = 0;
                      auVar248._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar100 + 4);
                      auVar251._0_16_ = ZEXT116(0) * auVar256 + ZEXT116(1) * auVar248;
                      auVar251._16_16_ =
                           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar256;
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        auVar179 = vpaddw_avx2(auVar251,auVar179);
                        auVar179 = vpsraw_avx2(auVar179,1);
                      }
                      else {
                        auVar179 = vpunpcklwd_avx2(auVar251,auVar179);
                        auVar179 = vpmaddwd_avx2(auVar179,auVar169);
                        auVar179 = vpsrad_avx2(auVar179,4);
                        auVar179 = vpackusdw_avx2(auVar179,auVar179);
                      }
                      auVar24._2_2_ = sVar121;
                      auVar24._0_2_ = sVar121;
                      auVar24._4_2_ = sVar121;
                      auVar24._6_2_ = sVar121;
                      auVar24._8_2_ = sVar121;
                      auVar24._10_2_ = sVar121;
                      auVar24._12_2_ = sVar121;
                      auVar24._14_2_ = sVar121;
                      auVar24._16_2_ = sVar121;
                      auVar24._18_2_ = sVar121;
                      auVar24._20_2_ = sVar121;
                      auVar24._22_2_ = sVar121;
                      auVar24._24_2_ = sVar121;
                      auVar24._26_2_ = sVar121;
                      auVar24._28_2_ = sVar121;
                      auVar24._30_2_ = sVar121;
                      auVar179 = vpaddw_avx2(auVar179,auVar24);
                      auVar179 = vpsraw_avx2(auVar179,auVar108);
                      auVar179 = vpackuswb_avx2(auVar179,auVar179);
                      *(int *)(local_588 + lVar41 * 2 + 4) = auVar179._0_4_;
                      *(int *)(local_580 + lVar41 * 2 + 4) = auVar179._16_4_;
                    }
                  }
                }
                lVar41 = lVar41 + lVar80;
                uVar42 = uVar42 + 2;
                pauVar59 = pauVar59 + 1;
                auVar179 = auVar112;
                auVar112 = auVar133;
                auVar113 = auVar111;
                auVar111 = auVar172;
                auVar172 = auVar153;
                auVar262 = auVar175;
              } while (uVar53 != uVar42);
            }
          }
          else if (gamma != 0 || delta == 0) {
            if (gamma != 0 && delta == 0) {
              if (0 < lVar40) {
                aWVar2 = av1_warped_filter[iVar81 + iVar51 >> 10];
                auVar118._16_2_ = aWVar2[0];
                auVar118._18_2_ = aWVar2[1];
                auVar118._20_2_ = aWVar2[2];
                auVar118._22_2_ = aWVar2[3];
                auVar118._24_2_ = aWVar2[4];
                auVar118._26_2_ = aWVar2[5];
                auVar118._28_2_ = aWVar2[6];
                auVar118._30_2_ = aWVar2[7];
                auVar118._0_2_ = aWVar2[0];
                auVar118._2_2_ = aWVar2[1];
                auVar118._4_2_ = aWVar2[2];
                auVar118._6_2_ = aWVar2[3];
                auVar118._8_2_ = aWVar2[4];
                auVar118._10_2_ = aWVar2[5];
                auVar118._12_2_ = aWVar2[6];
                auVar118._14_2_ = aWVar2[7];
                aWVar2 = av1_warped_filter[iVar10 + iVar51 >> 10];
                auVar136._16_2_ = aWVar2[0];
                auVar136._18_2_ = aWVar2[1];
                auVar136._20_2_ = aWVar2[2];
                auVar136._22_2_ = aWVar2[3];
                auVar136._24_2_ = aWVar2[4];
                auVar136._26_2_ = aWVar2[5];
                auVar136._28_2_ = aWVar2[6];
                auVar136._30_2_ = aWVar2[7];
                auVar136._0_2_ = aWVar2[0];
                auVar136._2_2_ = aWVar2[1];
                auVar136._4_2_ = aWVar2[2];
                auVar136._6_2_ = aWVar2[3];
                auVar136._8_2_ = aWVar2[4];
                auVar136._10_2_ = aWVar2[5];
                auVar136._12_2_ = aWVar2[6];
                auVar136._14_2_ = aWVar2[7];
                aWVar2 = av1_warped_filter[iVar11 + iVar51 >> 10];
                auVar157._16_2_ = aWVar2[0];
                auVar157._18_2_ = aWVar2[1];
                auVar157._20_2_ = aWVar2[2];
                auVar157._22_2_ = aWVar2[3];
                auVar157._24_2_ = aWVar2[4];
                auVar157._26_2_ = aWVar2[5];
                auVar157._28_2_ = aWVar2[6];
                auVar157._30_2_ = aWVar2[7];
                auVar157._0_2_ = aWVar2[0];
                auVar157._2_2_ = aWVar2[1];
                auVar157._4_2_ = aWVar2[2];
                auVar157._6_2_ = aWVar2[3];
                auVar157._8_2_ = aWVar2[4];
                auVar157._10_2_ = aWVar2[5];
                auVar157._12_2_ = aWVar2[6];
                auVar157._14_2_ = aWVar2[7];
                aWVar2 = av1_warped_filter[iVar8 + iVar51 >> 10];
                auVar180._16_2_ = aWVar2[0];
                auVar180._18_2_ = aWVar2[1];
                auVar180._20_2_ = aWVar2[2];
                auVar180._22_2_ = aWVar2[3];
                auVar180._24_2_ = aWVar2[4];
                auVar180._26_2_ = aWVar2[5];
                auVar180._28_2_ = aWVar2[6];
                auVar180._30_2_ = aWVar2[7];
                auVar180._0_2_ = aWVar2[0];
                auVar180._2_2_ = aWVar2[1];
                auVar180._4_2_ = aWVar2[2];
                auVar180._6_2_ = aWVar2[3];
                auVar180._8_2_ = aWVar2[4];
                auVar180._10_2_ = aWVar2[5];
                auVar180._12_2_ = aWVar2[6];
                auVar180._14_2_ = aWVar2[7];
                auVar178 = vpunpckhdq_avx2(auVar118,auVar136);
                auVar139 = vpunpckhdq_avx2(auVar157,auVar180);
                local_2e0._0_32_ = vpunpckhqdq_avx2(auVar178,auVar139);
                local_300 = vpunpcklqdq_avx2(auVar178,auVar139);
                auVar178 = vpunpckldq_avx2(auVar118,auVar136);
                auVar139 = vpunpckldq_avx2(auVar157,auVar180);
                auVar250 = vpunpckhqdq_avx2(auVar178,auVar139);
                auVar172 = vpunpcklqdq_avx2(auVar178,auVar139);
                aWVar2 = av1_warped_filter[iVar51 >> 10];
                auVar119._16_2_ = aWVar2[0];
                auVar119._18_2_ = aWVar2[1];
                auVar119._20_2_ = aWVar2[2];
                auVar119._22_2_ = aWVar2[3];
                auVar119._24_2_ = aWVar2[4];
                auVar119._26_2_ = aWVar2[5];
                auVar119._28_2_ = aWVar2[6];
                auVar119._30_2_ = aWVar2[7];
                auVar119._0_2_ = aWVar2[0];
                auVar119._2_2_ = aWVar2[1];
                auVar119._4_2_ = aWVar2[2];
                auVar119._6_2_ = aWVar2[3];
                auVar119._8_2_ = aWVar2[4];
                auVar119._10_2_ = aWVar2[5];
                auVar119._12_2_ = aWVar2[6];
                auVar119._14_2_ = aWVar2[7];
                aWVar2 = av1_warped_filter[iVar81 * 2 + iVar51 >> 10];
                auVar137._16_2_ = aWVar2[0];
                auVar137._18_2_ = aWVar2[1];
                auVar137._20_2_ = aWVar2[2];
                auVar137._22_2_ = aWVar2[3];
                auVar137._24_2_ = aWVar2[4];
                auVar137._26_2_ = aWVar2[5];
                auVar137._28_2_ = aWVar2[6];
                auVar137._30_2_ = aWVar2[7];
                auVar137._0_2_ = aWVar2[0];
                auVar137._2_2_ = aWVar2[1];
                auVar137._4_2_ = aWVar2[2];
                auVar137._6_2_ = aWVar2[3];
                auVar137._8_2_ = aWVar2[4];
                auVar137._10_2_ = aWVar2[5];
                auVar137._12_2_ = aWVar2[6];
                auVar137._14_2_ = aWVar2[7];
                aWVar2 = av1_warped_filter[iVar81 * 4 + iVar51 >> 10];
                auVar158._16_2_ = aWVar2[0];
                auVar158._18_2_ = aWVar2[1];
                auVar158._20_2_ = aWVar2[2];
                auVar158._22_2_ = aWVar2[3];
                auVar158._24_2_ = aWVar2[4];
                auVar158._26_2_ = aWVar2[5];
                auVar158._28_2_ = aWVar2[6];
                auVar158._30_2_ = aWVar2[7];
                auVar158._0_2_ = aWVar2[0];
                auVar158._2_2_ = aWVar2[1];
                auVar158._4_2_ = aWVar2[2];
                auVar158._6_2_ = aWVar2[3];
                auVar158._8_2_ = aWVar2[4];
                auVar158._10_2_ = aWVar2[5];
                auVar158._12_2_ = aWVar2[6];
                auVar158._14_2_ = aWVar2[7];
                aWVar2 = av1_warped_filter[iVar51 + iVar9 >> 10];
                auVar181._16_2_ = aWVar2[0];
                auVar181._18_2_ = aWVar2[1];
                auVar181._20_2_ = aWVar2[2];
                auVar181._22_2_ = aWVar2[3];
                auVar181._24_2_ = aWVar2[4];
                auVar181._26_2_ = aWVar2[5];
                auVar181._28_2_ = aWVar2[6];
                auVar181._30_2_ = aWVar2[7];
                auVar181._0_2_ = aWVar2[0];
                auVar181._2_2_ = aWVar2[1];
                auVar181._4_2_ = aWVar2[2];
                auVar181._6_2_ = aWVar2[3];
                auVar181._8_2_ = aWVar2[4];
                auVar181._10_2_ = aWVar2[5];
                auVar181._12_2_ = aWVar2[6];
                auVar181._14_2_ = aWVar2[7];
                auVar178 = vpunpckhdq_avx2(auVar119,auVar137);
                auVar139 = vpunpckhdq_avx2(auVar158,auVar181);
                auVar179 = vpunpckhqdq_avx2(auVar178,auVar139);
                auVar133 = vpunpcklqdq_avx2(auVar178,auVar139);
                auVar178 = vpunpckldq_avx2(auVar119,auVar137);
                auVar139 = vpunpckldq_avx2(auVar158,auVar181);
                auVar262 = vpunpckhqdq_avx2(auVar178,auVar139);
                auVar153 = vpunpcklqdq_avx2(auVar178,auVar139);
                auVar139 = vperm2i128_avx2(local_120,local_100,0x21);
                auVar243 = vpunpckhwd_avx2(local_120,auVar139);
                auVar111 = vperm2i128_avx2(local_140,local_120,0x21);
                auVar178 = vpunpckhwd_avx2(local_140,auVar111);
                auVar112 = vpunpcklwd_avx2(local_120,auVar139);
                auVar113 = vperm2i128_avx2(local_160,local_140,0x21);
                auVar111 = vpunpcklwd_avx2(local_140,auVar111);
                auVar139 = vpunpckhwd_avx2(local_160,auVar113);
                auVar113 = vpunpcklwd_avx2(local_160,auVar113);
                uVar42 = 0xfffffffffffffffe;
                pauVar59 = (undefined1 (*) [32])local_e0;
                lVar41 = 0;
                do {
                  auVar175 = auVar111;
                  auVar111 = auVar112;
                  auVar135 = auVar178;
                  auVar113 = vpmaddwd_avx2(auVar113,auVar153);
                  auVar178 = pauVar59[-1];
                  auVar116 = vperm2i128_avx2(auVar178,*pauVar59,0x21);
                  auVar112 = vpunpcklwd_avx2(auVar178,auVar116);
                  auVar174 = vpmaddwd_avx2(auVar175,auVar262);
                  auVar113 = vpaddd_avx2(auVar174,auVar113);
                  auVar174 = vpmaddwd_avx2(auVar133,auVar111);
                  auVar113 = vpaddd_avx2(auVar174,auVar113);
                  auVar174 = vpmaddwd_avx2(auVar112,auVar179);
                  auVar113 = vpaddd_avx2(auVar174,auVar113);
                  auVar139 = vpmaddwd_avx2(auVar139,auVar172);
                  auVar174 = vpunpckhwd_avx2(auVar178,auVar116);
                  auVar178 = vpmaddwd_avx2(auVar135,auVar250);
                  auVar178 = vpaddd_avx2(auVar139,auVar178);
                  auVar139 = vpmaddwd_avx2(auVar243,local_300);
                  auVar178 = vpaddd_avx2(auVar139,auVar178);
                  auVar139 = vpmaddwd_avx2(auVar174,local_2e0._0_32_);
                  auVar178 = vpaddd_avx2(auVar139,auVar178);
                  auVar116 = vpunpckldq_avx2(auVar113,auVar178);
                  auVar139 = vpunpckhdq_avx2(auVar113,auVar178);
                  auVar16._4_4_ = iVar85;
                  auVar16._0_4_ = iVar85;
                  auVar16._8_4_ = iVar85;
                  auVar16._12_4_ = iVar85;
                  auVar16._16_4_ = iVar85;
                  auVar16._20_4_ = iVar85;
                  auVar16._24_4_ = iVar85;
                  auVar16._28_4_ = iVar85;
                  auVar178 = vpaddd_avx2(auVar116,auVar16);
                  if (conv_params->is_compound == 0) {
                    auVar113 = vpsrad_avx2(auVar178,auVar127);
                    auVar178 = vpaddd_avx2(auVar16,auVar139);
                    auVar178 = vpsrad_avx2(auVar178,auVar127);
                    auVar178 = vpackssdw_avx2(auVar113,auVar178);
                    auVar178 = vpackuswb_avx2(auVar178,auVar243);
                    if (p_width == 4) {
                      *(int *)(local_588 + lVar41 * 2) = auVar178._0_4_;
                      *(int *)(local_580 + lVar41 * 2) = auVar178._16_4_;
                    }
                    else {
                      *(long *)(local_588 + lVar41 * 2) = auVar178._0_8_;
                      *(long *)(local_580 + lVar41 * 2) = auVar178._16_8_;
                    }
                  }
                  else {
                    iVar51 = iVar64 + (int)uVar42 + 2;
                    lVar100 = (long)(iVar51 * conv_params->dst_stride);
                    pCVar3 = conv_params->dst;
                    iVar36 = iVar64 + (int)uVar42 + 3;
                    auVar178 = vpsrad_avx2(auVar178,auVar127);
                    lVar93 = (long)(iVar36 * conv_params->dst_stride);
                    auVar178 = vpackusdw_avx2(auVar178,auVar178);
                    if (conv_params->do_average == 0) {
                      *(long *)(pCVar3 + lVar70 + lVar100) = auVar178._0_8_;
                      *(long *)(pCVar3 + lVar70 + lVar93) = auVar178._16_8_;
                    }
                    else {
                      auVar249._8_8_ = 0;
                      auVar249._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar93);
                      auVar241._8_8_ = 0;
                      auVar241._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar100);
                      auVar244._0_16_ = ZEXT116(0) * auVar249 + ZEXT116(1) * auVar241;
                      auVar244._16_16_ =
                           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar249;
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        auVar178 = vpaddw_avx2(auVar244,auVar178);
                        auVar178 = vpsraw_avx2(auVar178,1);
                      }
                      else {
                        auVar178 = vpunpcklwd_avx2(auVar244,auVar178);
                        auVar178 = vpmaddwd_avx2(auVar178,auVar169);
                        auVar178 = vpsrad_avx2(auVar178,4);
                        auVar178 = vpackusdw_avx2(auVar178,auVar178);
                      }
                      auVar25._2_2_ = sVar121;
                      auVar25._0_2_ = sVar121;
                      auVar25._4_2_ = sVar121;
                      auVar25._6_2_ = sVar121;
                      auVar25._8_2_ = sVar121;
                      auVar25._10_2_ = sVar121;
                      auVar25._12_2_ = sVar121;
                      auVar25._14_2_ = sVar121;
                      auVar25._16_2_ = sVar121;
                      auVar25._18_2_ = sVar121;
                      auVar25._20_2_ = sVar121;
                      auVar25._22_2_ = sVar121;
                      auVar25._24_2_ = sVar121;
                      auVar25._26_2_ = sVar121;
                      auVar25._28_2_ = sVar121;
                      auVar25._30_2_ = sVar121;
                      auVar178 = vpaddw_avx2(auVar178,auVar25);
                      auVar178 = vpsraw_avx2(auVar178,auVar108);
                      auVar178 = vpackuswb_avx2(auVar178,auVar178);
                      *(int *)(local_588 + lVar41 * 2) = auVar178._0_4_;
                      *(int *)(local_580 + lVar41 * 2) = auVar178._16_4_;
                    }
                    if (4 < p_width) {
                      lVar100 = (long)(iVar51 * conv_params->dst_stride);
                      lVar93 = (long)(iVar36 * conv_params->dst_stride);
                      auVar17._4_4_ = iVar85;
                      auVar17._0_4_ = iVar85;
                      auVar17._8_4_ = iVar85;
                      auVar17._12_4_ = iVar85;
                      auVar17._16_4_ = iVar85;
                      auVar17._20_4_ = iVar85;
                      auVar17._24_4_ = iVar85;
                      auVar17._28_4_ = iVar85;
                      auVar178 = vpaddd_avx2(auVar139,auVar17);
                      auVar178 = vpsrad_avx2(auVar178,auVar127);
                      auVar178 = vpackusdw_avx2(auVar178,auVar178);
                      pCVar3 = conv_params->dst;
                      if (conv_params->do_average == 0) {
                        *(long *)(pCVar3 + lVar70 + lVar100 + 4) = auVar178._0_8_;
                        *(long *)(pCVar3 + lVar70 + lVar93 + 4) = auVar178._16_8_;
                      }
                      else {
                        auVar242._8_8_ = 0;
                        auVar242._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar93 + 4);
                        auVar203._8_8_ = 0;
                        auVar203._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar100 + 4);
                        auVar208._0_16_ = ZEXT116(0) * auVar242 + ZEXT116(1) * auVar203;
                        auVar208._16_16_ =
                             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar242;
                        if (conv_params->use_dist_wtd_comp_avg == 0) {
                          auVar178 = vpaddw_avx2(auVar178,auVar208);
                          auVar178 = vpsraw_avx2(auVar178,1);
                        }
                        else {
                          auVar178 = vpunpcklwd_avx2(auVar208,auVar178);
                          auVar178 = vpmaddwd_avx2(auVar178,auVar169);
                          auVar178 = vpsrad_avx2(auVar178,4);
                          auVar178 = vpackusdw_avx2(auVar178,auVar178);
                        }
                        auVar26._2_2_ = sVar121;
                        auVar26._0_2_ = sVar121;
                        auVar26._4_2_ = sVar121;
                        auVar26._6_2_ = sVar121;
                        auVar26._8_2_ = sVar121;
                        auVar26._10_2_ = sVar121;
                        auVar26._12_2_ = sVar121;
                        auVar26._14_2_ = sVar121;
                        auVar26._16_2_ = sVar121;
                        auVar26._18_2_ = sVar121;
                        auVar26._20_2_ = sVar121;
                        auVar26._22_2_ = sVar121;
                        auVar26._24_2_ = sVar121;
                        auVar26._26_2_ = sVar121;
                        auVar26._28_2_ = sVar121;
                        auVar26._30_2_ = sVar121;
                        auVar178 = vpaddw_avx2(auVar178,auVar26);
                        auVar178 = vpsraw_avx2(auVar178,auVar108);
                        auVar178 = vpackuswb_avx2(auVar178,auVar178);
                        *(int *)(local_588 + lVar41 * 2 + 4) = auVar178._0_4_;
                        *(int *)(local_580 + lVar41 * 2 + 4) = auVar178._16_4_;
                      }
                    }
                  }
                  lVar41 = lVar41 + lVar80;
                  uVar42 = uVar42 + 2;
                  pauVar59 = pauVar59 + 1;
                  auVar178 = auVar243;
                  auVar243 = auVar174;
                  auVar113 = auVar175;
                  auVar139 = auVar135;
                } while (uVar53 != uVar42);
              }
            }
            else if (0 < lVar40) {
              auVar250 = vperm2i128_avx2(local_120,local_100,0x21);
              auVar243 = vpunpckhwd_avx2(local_120,auVar250);
              auVar179 = vperm2i128_avx2(local_140,local_120,0x21);
              auVar178 = vpunpckhwd_avx2(local_140,auVar179);
              auVar262 = vperm2i128_avx2(local_160,local_140,0x21);
              auVar139 = vpunpckhwd_avx2(local_160,auVar262);
              auVar250 = vpunpcklwd_avx2(local_120,auVar250);
              auVar179 = vpunpcklwd_avx2(local_140,auVar179);
              auVar262 = vpunpcklwd_avx2(local_160,auVar262);
              uVar42 = 0xfffffffffffffffe;
              pauVar59 = (undefined1 (*) [32])local_e0;
              lVar41 = 0;
              do {
                local_420 = auVar178;
                auVar116 = auVar250;
                auVar120._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar89 + iVar51 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar51 >> 10];
                auVar120._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar89 + iVar51 >> 10];
                auVar138._0_16_ =
                     ZEXT116(0) *
                     (undefined1  [16])av1_warped_filter[iVar89 + iVar81 * 2 + iVar51 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar81 * 2 + iVar51 >> 10];
                auVar138._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) *
                     (undefined1  [16])av1_warped_filter[iVar89 + iVar81 * 2 + iVar51 >> 10];
                auVar159._0_16_ =
                     ZEXT116(0) *
                     (undefined1  [16])av1_warped_filter[iVar89 + iVar81 * 4 + iVar51 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar81 * 4 + iVar51 >> 10];
                auVar159._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) *
                     (undefined1  [16])av1_warped_filter[iVar89 + iVar81 * 4 + iVar51 >> 10];
                auVar196._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar9 + iVar89 + iVar51 >> 10]
                     + ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar9 + iVar51 >> 10];
                auVar196._16_16_ =
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar9 + iVar89 + iVar51 >> 10]
                ;
                auVar182._0_16_ =
                     ZEXT116(0) *
                     (undefined1  [16])av1_warped_filter[iVar89 + iVar81 + iVar51 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar81 + iVar51 >> 10];
                auVar182._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) *
                     (undefined1  [16])av1_warped_filter[iVar89 + iVar81 + iVar51 >> 10];
                auVar218._0_16_ =
                     ZEXT116(0) *
                     (undefined1  [16])av1_warped_filter[iVar10 + iVar89 + iVar51 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar10 + iVar51 >> 10];
                auVar218._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) *
                     (undefined1  [16])av1_warped_filter[iVar10 + iVar89 + iVar51 >> 10];
                auVar226._0_16_ =
                     ZEXT116(0) *
                     (undefined1  [16])av1_warped_filter[iVar11 + iVar89 + iVar51 >> 10] +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar11 + iVar51 >> 10];
                auVar226._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) *
                     (undefined1  [16])av1_warped_filter[iVar11 + iVar89 + iVar51 >> 10];
                auVar231._0_16_ =
                     ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar8 + iVar89 + iVar51 >> 10]
                     + ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar8 + iVar51 >> 10];
                auVar231._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar8 + iVar89 + iVar51 >> 10]
                ;
                auVar112 = vpunpckldq_avx2(auVar120,auVar138);
                auVar111 = vpunpckldq_avx2(auVar159,auVar196);
                auVar178 = vpunpckhdq_avx2(auVar120,auVar138);
                auVar250 = vpunpckhdq_avx2(auVar159,auVar196);
                auVar113 = vpunpcklqdq_avx2(auVar112,auVar111);
                auVar262 = vpmaddwd_avx2(auVar262,auVar113);
                auVar111 = vpunpckhqdq_avx2(auVar112,auVar111);
                auVar153 = vpunpcklqdq_avx2(auVar178,auVar250);
                auVar113 = vpunpckhqdq_avx2(auVar178,auVar250);
                auVar250 = vpunpckldq_avx2(auVar182,auVar218);
                auVar172 = vpunpckldq_avx2(auVar226,auVar231);
                auVar178 = vpunpcklqdq_avx2(auVar250,auVar172);
                auVar112 = vpmaddwd_avx2(auVar139,auVar178);
                auVar178 = vpunpckhdq_avx2(auVar182,auVar218);
                auVar139 = vpunpckhdq_avx2(auVar226,auVar231);
                auVar172 = vpunpckhqdq_avx2(auVar250,auVar172);
                auVar174 = vpunpcklqdq_avx2(auVar178,auVar139);
                auVar133 = vpunpckhqdq_avx2(auVar178,auVar139);
                auVar178 = pauVar59[-1];
                auVar175 = vperm2i128_avx2(auVar178,*pauVar59,0x21);
                auVar250 = vpunpcklwd_avx2(auVar178,auVar175);
                auVar139 = vpmaddwd_avx2(auVar179,auVar111);
                auVar139 = vpaddd_avx2(auVar139,auVar262);
                auVar262 = vpmaddwd_avx2(auVar116,auVar153);
                auVar111 = vpmaddwd_avx2(auVar250,auVar113);
                auVar262 = vpaddd_avx2(auVar262,auVar111);
                auVar139 = vpaddd_avx2(auVar139,auVar262);
                auVar111 = vpunpckhwd_avx2(auVar178,auVar175);
                auVar178 = vpmaddwd_avx2(local_420,auVar172);
                auVar178 = vpaddd_avx2(auVar178,auVar112);
                auVar262 = vpmaddwd_avx2(auVar243,auVar174);
                auVar112 = vpmaddwd_avx2(auVar111,auVar133);
                auVar262 = vpaddd_avx2(auVar262,auVar112);
                auVar178 = vpaddd_avx2(auVar178,auVar262);
                auVar262 = vpunpckldq_avx2(auVar139,auVar178);
                auVar178 = vpunpckhdq_avx2(auVar139,auVar178);
                if (conv_params->is_compound == 0) {
                  auVar19._4_4_ = iVar85;
                  auVar19._0_4_ = iVar85;
                  auVar19._8_4_ = iVar85;
                  auVar19._12_4_ = iVar85;
                  auVar19._16_4_ = iVar85;
                  auVar19._20_4_ = iVar85;
                  auVar19._24_4_ = iVar85;
                  auVar19._28_4_ = iVar85;
                  auVar139 = vpaddd_avx2(auVar262,auVar19);
                  auVar139 = vpsrad_avx2(auVar139,auVar127);
                  auVar178 = vpaddd_avx2(auVar178,auVar19);
                  auVar178 = vpsrad_avx2(auVar178,auVar127);
                  auVar178 = vpackssdw_avx2(auVar139,auVar178);
                  auVar178 = vpackuswb_avx2(auVar178,auVar178);
                  if (p_width == 4) {
                    *(int *)(local_588 + lVar41 * 2) = auVar178._0_4_;
                    *(int *)(local_580 + lVar41 * 2) = auVar178._16_4_;
                  }
                  else {
                    *(long *)(local_588 + lVar41 * 2) = auVar178._0_8_;
                    *(long *)(local_580 + lVar41 * 2) = auVar178._16_8_;
                  }
                }
                else {
                  iVar36 = iVar64 + (int)uVar42 + 2;
                  lVar100 = (long)(iVar36 * conv_params->dst_stride);
                  pCVar3 = conv_params->dst;
                  iVar79 = iVar64 + (int)uVar42 + 3;
                  auVar18._4_4_ = iVar85;
                  auVar18._0_4_ = iVar85;
                  auVar18._8_4_ = iVar85;
                  auVar18._12_4_ = iVar85;
                  auVar18._16_4_ = iVar85;
                  auVar18._20_4_ = iVar85;
                  auVar18._24_4_ = iVar85;
                  auVar18._28_4_ = iVar85;
                  auVar139 = vpaddd_avx2(auVar262,auVar18);
                  auVar139 = vpsrad_avx2(auVar139,auVar127);
                  lVar93 = (long)(iVar79 * conv_params->dst_stride);
                  auVar139 = vpackusdw_avx2(auVar139,auVar139);
                  if (conv_params->do_average == 0) {
                    *(long *)(pCVar3 + lVar70 + lVar100) = auVar139._0_8_;
                    *(long *)(pCVar3 + lVar70 + lVar93) = auVar139._16_8_;
                  }
                  else {
                    auVar168._8_8_ = 0;
                    auVar168._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar93);
                    auVar150._8_8_ = 0;
                    auVar150._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar100);
                    auVar160._0_16_ = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar150;
                    auVar160._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
                    if (conv_params->use_dist_wtd_comp_avg == 0) {
                      auVar139 = vpaddw_avx2(auVar139,auVar160);
                      auVar139 = vpsraw_avx2(auVar139,1);
                    }
                    else {
                      auVar139 = vpunpcklwd_avx2(auVar160,auVar139);
                      auVar139 = vpmaddwd_avx2(auVar139,auVar169);
                      auVar139 = vpsrad_avx2(auVar139,4);
                      auVar139 = vpackusdw_avx2(auVar139,auVar139);
                    }
                    auVar27._2_2_ = sVar121;
                    auVar27._0_2_ = sVar121;
                    auVar27._4_2_ = sVar121;
                    auVar27._6_2_ = sVar121;
                    auVar27._8_2_ = sVar121;
                    auVar27._10_2_ = sVar121;
                    auVar27._12_2_ = sVar121;
                    auVar27._14_2_ = sVar121;
                    auVar27._16_2_ = sVar121;
                    auVar27._18_2_ = sVar121;
                    auVar27._20_2_ = sVar121;
                    auVar27._22_2_ = sVar121;
                    auVar27._24_2_ = sVar121;
                    auVar27._26_2_ = sVar121;
                    auVar27._28_2_ = sVar121;
                    auVar27._30_2_ = sVar121;
                    auVar139 = vpaddw_avx2(auVar139,auVar27);
                    auVar139 = vpsraw_avx2(auVar139,auVar108);
                    auVar139 = vpackuswb_avx2(auVar139,auVar139);
                    *(int *)(local_588 + lVar41 * 2) = auVar139._0_4_;
                    *(int *)(local_580 + lVar41 * 2) = auVar139._16_4_;
                  }
                  if (4 < p_width) {
                    lVar100 = (long)(iVar36 * conv_params->dst_stride);
                    lVar93 = (long)(iVar79 * conv_params->dst_stride);
                    auVar20._4_4_ = iVar85;
                    auVar20._0_4_ = iVar85;
                    auVar20._8_4_ = iVar85;
                    auVar20._12_4_ = iVar85;
                    auVar20._16_4_ = iVar85;
                    auVar20._20_4_ = iVar85;
                    auVar20._24_4_ = iVar85;
                    auVar20._28_4_ = iVar85;
                    auVar178 = vpaddd_avx2(auVar178,auVar20);
                    auVar178 = vpsrad_avx2(auVar178,auVar127);
                    auVar178 = vpackusdw_avx2(auVar178,auVar178);
                    pCVar3 = conv_params->dst;
                    if (conv_params->do_average == 0) {
                      *(long *)(pCVar3 + lVar70 + lVar100 + 4) = auVar178._0_8_;
                      *(long *)(pCVar3 + lVar70 + lVar93 + 4) = auVar178._16_8_;
                    }
                    else {
                      auVar151._8_8_ = 0;
                      auVar151._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar93 + 4);
                      auVar129._8_8_ = 0;
                      auVar129._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar100 + 4);
                      auVar140._0_16_ = ZEXT116(0) * auVar151 + ZEXT116(1) * auVar129;
                      auVar140._16_16_ =
                           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar151;
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        auVar178 = vpaddw_avx2(auVar178,auVar140);
                        auVar178 = vpsraw_avx2(auVar178,1);
                      }
                      else {
                        auVar178 = vpunpcklwd_avx2(auVar140,auVar178);
                        auVar178 = vpmaddwd_avx2(auVar178,auVar169);
                        auVar178 = vpsrad_avx2(auVar178,4);
                        auVar178 = vpackusdw_avx2(auVar178,auVar178);
                      }
                      auVar28._2_2_ = sVar121;
                      auVar28._0_2_ = sVar121;
                      auVar28._4_2_ = sVar121;
                      auVar28._6_2_ = sVar121;
                      auVar28._8_2_ = sVar121;
                      auVar28._10_2_ = sVar121;
                      auVar28._12_2_ = sVar121;
                      auVar28._14_2_ = sVar121;
                      auVar28._16_2_ = sVar121;
                      auVar28._18_2_ = sVar121;
                      auVar28._20_2_ = sVar121;
                      auVar28._22_2_ = sVar121;
                      auVar28._24_2_ = sVar121;
                      auVar28._26_2_ = sVar121;
                      auVar28._28_2_ = sVar121;
                      auVar28._30_2_ = sVar121;
                      auVar178 = vpaddw_avx2(auVar178,auVar28);
                      auVar178 = vpsraw_avx2(auVar178,auVar108);
                      auVar178 = vpackuswb_avx2(auVar178,auVar178);
                      *(int *)(local_588 + lVar41 * 2 + 4) = auVar178._0_4_;
                      *(int *)(local_580 + lVar41 * 2 + 4) = auVar178._16_4_;
                    }
                  }
                }
                lVar41 = lVar41 + lVar80;
                uVar42 = uVar42 + 2;
                iVar51 = iVar51 + iVar89 * 2;
                pauVar59 = pauVar59 + 1;
                auVar262 = auVar179;
                auVar179 = auVar116;
                local_490 = auVar127;
                auVar178 = auVar243;
                auVar243 = auVar111;
                auVar139 = local_420;
              } while (uVar53 != uVar42);
            }
          }
          else if (0 < lVar40) {
            auVar250 = vperm2i128_avx2(local_120,local_100,0x21);
            auVar243 = vpunpckhwd_avx2(local_120,auVar250);
            auVar179 = vperm2i128_avx2(local_140,local_120,0x21);
            auVar178 = vpunpckhwd_avx2(local_140,auVar179);
            auVar112 = vperm2i128_avx2(local_160,local_140,0x21);
            auVar139 = vpunpckhwd_avx2(local_160,auVar112);
            auVar262 = vpunpcklwd_avx2(local_120,auVar250);
            auVar250 = vpunpcklwd_avx2(local_140,auVar179);
            auVar179 = vpunpcklwd_avx2(local_160,auVar112);
            uVar42 = 0xfffffffffffffffe;
            pauVar59 = (undefined1 (*) [32])local_e0;
            lVar41 = 0;
            do {
              auVar116 = auVar250;
              auVar175 = auVar178;
              auVar156._0_16_ =
                   ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar89 + iVar51 >> 10] +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar51 >> 10];
              auVar156._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar89 + iVar51 >> 10];
              auVar111 = vpshufd_avx2(auVar156,0);
              auVar113 = vpshufd_avx2(auVar156,0x55);
              auVar172 = vpshufd_avx2(auVar156,0xaa);
              auVar133 = vpshufd_avx2(auVar156,0xff);
              auVar178 = pauVar59[-1];
              auVar174 = vperm2i128_avx2(auVar178,*pauVar59,0x21);
              auVar153 = vpunpcklwd_avx2(auVar178,auVar174);
              auVar250 = vpmaddwd_avx2(auVar179,auVar111);
              auVar179 = vpmaddwd_avx2(auVar116,auVar113);
              auVar250 = vpaddd_avx2(auVar179,auVar250);
              auVar179 = vpmaddwd_avx2(auVar172,auVar262);
              auVar112 = vpmaddwd_avx2(auVar133,auVar153);
              auVar179 = vpaddd_avx2(auVar179,auVar112);
              auVar250 = vpaddd_avx2(auVar179,auVar250);
              auVar112 = vpunpckhwd_avx2(auVar178,auVar174);
              auVar178 = vpmaddwd_avx2(auVar139,auVar111);
              auVar139 = vpmaddwd_avx2(auVar113,auVar175);
              auVar178 = vpaddd_avx2(auVar139,auVar178);
              auVar139 = vpmaddwd_avx2(auVar172,auVar243);
              auVar179 = vpmaddwd_avx2(auVar133,auVar112);
              auVar139 = vpaddd_avx2(auVar179,auVar139);
              auVar178 = vpaddd_avx2(auVar178,auVar139);
              auVar179 = vpunpckldq_avx2(auVar250,auVar178);
              auVar139 = vpunpckhdq_avx2(auVar250,auVar178);
              auVar14._4_4_ = iVar85;
              auVar14._0_4_ = iVar85;
              auVar14._8_4_ = iVar85;
              auVar14._12_4_ = iVar85;
              auVar14._16_4_ = iVar85;
              auVar14._20_4_ = iVar85;
              auVar14._24_4_ = iVar85;
              auVar14._28_4_ = iVar85;
              auVar178 = vpaddd_avx2(auVar14,auVar179);
              if (conv_params->is_compound == 0) {
                auVar250 = vpsrad_avx2(auVar178,auVar127);
                auVar178 = vpaddd_avx2(auVar14,auVar139);
                auVar178 = vpsrad_avx2(auVar178,auVar127);
                auVar178 = vpackssdw_avx2(auVar250,auVar178);
                auVar178 = vpackuswb_avx2(auVar178,auVar243);
                if (p_width == 4) {
                  *(int *)(local_588 + lVar41 * 2) = auVar178._0_4_;
                  *(int *)(local_580 + lVar41 * 2) = auVar178._16_4_;
                }
                else {
                  *(long *)(local_588 + lVar41 * 2) = auVar178._0_8_;
                  *(long *)(local_580 + lVar41 * 2) = auVar178._16_8_;
                }
              }
              else {
                iVar36 = iVar64 + (int)uVar42 + 2;
                lVar100 = (long)(iVar36 * conv_params->dst_stride);
                pCVar3 = conv_params->dst;
                iVar79 = iVar64 + (int)uVar42 + 3;
                auVar178 = vpsrad_avx2(auVar178,auVar127);
                lVar93 = (long)(iVar79 * conv_params->dst_stride);
                auVar178 = vpackusdw_avx2(auVar178,auVar178);
                if (conv_params->do_average == 0) {
                  *(long *)(pCVar3 + lVar70 + lVar100) = auVar178._0_8_;
                  *(long *)(pCVar3 + lVar70 + lVar93) = auVar178._16_8_;
                }
                else {
                  auVar230._8_8_ = 0;
                  auVar230._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar93);
                  auVar223._8_8_ = 0;
                  auVar223._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar100);
                  auVar225._0_16_ = ZEXT116(0) * auVar230 + ZEXT116(1) * auVar223;
                  auVar225._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar230;
                  if (conv_params->use_dist_wtd_comp_avg == 0) {
                    auVar178 = vpaddw_avx2(auVar178,auVar225);
                    auVar178 = vpsraw_avx2(auVar178,1);
                  }
                  else {
                    auVar178 = vpunpcklwd_avx2(auVar225,auVar178);
                    auVar178 = vpmaddwd_avx2(auVar178,auVar169);
                    auVar178 = vpsrad_avx2(auVar178,4);
                    auVar178 = vpackusdw_avx2(auVar178,auVar178);
                  }
                  auVar21._2_2_ = sVar121;
                  auVar21._0_2_ = sVar121;
                  auVar21._4_2_ = sVar121;
                  auVar21._6_2_ = sVar121;
                  auVar21._8_2_ = sVar121;
                  auVar21._10_2_ = sVar121;
                  auVar21._12_2_ = sVar121;
                  auVar21._14_2_ = sVar121;
                  auVar21._16_2_ = sVar121;
                  auVar21._18_2_ = sVar121;
                  auVar21._20_2_ = sVar121;
                  auVar21._22_2_ = sVar121;
                  auVar21._24_2_ = sVar121;
                  auVar21._26_2_ = sVar121;
                  auVar21._28_2_ = sVar121;
                  auVar21._30_2_ = sVar121;
                  auVar178 = vpaddw_avx2(auVar178,auVar21);
                  auVar178 = vpsraw_avx2(auVar178,auVar108);
                  auVar178 = vpackuswb_avx2(auVar178,auVar178);
                  *(int *)(local_588 + lVar41 * 2) = auVar178._0_4_;
                  *(int *)(local_580 + lVar41 * 2) = auVar178._16_4_;
                }
                if (4 < p_width) {
                  lVar100 = (long)(iVar36 * conv_params->dst_stride);
                  lVar93 = (long)(iVar79 * conv_params->dst_stride);
                  auVar178 = vpaddd_avx2(auVar14,auVar139);
                  auVar178 = vpsrad_avx2(auVar178,auVar127);
                  auVar178 = vpackusdw_avx2(auVar178,auVar178);
                  pCVar3 = conv_params->dst;
                  if (conv_params->do_average == 0) {
                    *(long *)(pCVar3 + lVar70 + lVar100 + 4) = auVar178._0_8_;
                    *(long *)(pCVar3 + lVar70 + lVar93 + 4) = auVar178._16_8_;
                  }
                  else {
                    auVar224._8_8_ = 0;
                    auVar224._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar93 + 4);
                    auVar213._8_8_ = 0;
                    auVar213._0_8_ = *(ulong *)(pCVar3 + lVar70 + lVar100 + 4);
                    auVar217._0_16_ = ZEXT116(0) * auVar224 + ZEXT116(1) * auVar213;
                    auVar217._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar224;
                    if (conv_params->use_dist_wtd_comp_avg == 0) {
                      auVar178 = vpaddw_avx2(auVar178,auVar217);
                      auVar178 = vpsraw_avx2(auVar178,1);
                    }
                    else {
                      auVar178 = vpunpcklwd_avx2(auVar217,auVar178);
                      auVar178 = vpmaddwd_avx2(auVar178,auVar169);
                      auVar178 = vpsrad_avx2(auVar178,4);
                      auVar178 = vpackusdw_avx2(auVar178,auVar178);
                    }
                    auVar22._2_2_ = sVar121;
                    auVar22._0_2_ = sVar121;
                    auVar22._4_2_ = sVar121;
                    auVar22._6_2_ = sVar121;
                    auVar22._8_2_ = sVar121;
                    auVar22._10_2_ = sVar121;
                    auVar22._12_2_ = sVar121;
                    auVar22._14_2_ = sVar121;
                    auVar22._16_2_ = sVar121;
                    auVar22._18_2_ = sVar121;
                    auVar22._20_2_ = sVar121;
                    auVar22._22_2_ = sVar121;
                    auVar22._24_2_ = sVar121;
                    auVar22._26_2_ = sVar121;
                    auVar22._28_2_ = sVar121;
                    auVar22._30_2_ = sVar121;
                    auVar178 = vpaddw_avx2(auVar178,auVar22);
                    auVar178 = vpsraw_avx2(auVar178,auVar108);
                    auVar178 = vpackuswb_avx2(auVar178,auVar178);
                    *(int *)(local_588 + lVar41 * 2 + 4) = auVar178._0_4_;
                    *(int *)(local_580 + lVar41 * 2 + 4) = auVar178._16_4_;
                  }
                }
              }
              lVar41 = lVar41 + lVar80;
              uVar42 = uVar42 + 2;
              iVar51 = iVar51 + iVar89 * 2;
              pauVar59 = pauVar59 + 1;
              auVar178 = auVar243;
              auVar243 = auVar112;
              auVar250 = auVar262;
              auVar262 = auVar153;
              auVar139 = auVar175;
              auVar179 = auVar116;
            } while (uVar53 != uVar42);
          }
          lVar70 = lVar70 + 8;
          local_580 = local_580 + 8;
          local_588 = local_588 + 8;
          auVar235 = ZEXT1664(auVar232);
          auVar245 = ZEXT3264(CONCAT1616(_DAT_0056c940,_DAT_0056c940));
          auVar252 = ZEXT3264(CONCAT1616(_DAT_0056d060,_DAT_0056d060));
          auVar258 = ZEXT3264(CONCAT1616(_DAT_0056d070,_DAT_0056d070));
          auVar263 = ZEXT3264(CONCAT1616(_DAT_0056d080,_DAT_0056d080));
        } while (lVar70 < p_width);
      }
      local_538 = local_538 + 8;
      p_height = p_height - 8;
      local_360 = local_360 + lVar80 * 8;
      local_400 = local_400 + lVar80 * 8;
    } while (local_538 < uVar39);
  }
  return;
}

Assistant:

void av1_warp_affine_avx2(const int32_t *mat, const uint8_t *ref, int width,
                          int height, int stride, uint8_t *pred, int p_col,
                          int p_row, int p_width, int p_height, int p_stride,
                          int subsampling_x, int subsampling_y,
                          ConvolveParams *conv_params, int16_t alpha,
                          int16_t beta, int16_t gamma, int16_t delta) {
  __m256i horz_out[8];
  int i, j, k;
  const int bd = 8;
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const __m256i reduce_bits_vert_const =
      _mm256_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m256i res_add_const = _mm256_set1_epi32(1 << offset_bits_vert);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  assert(IMPLIES(conv_params->do_average, conv_params->is_compound));

  const __m256i round_const = _mm256_set1_epi16(
      (1 << offset_bits_horiz) + ((1 << reduce_bits_horiz) >> 1));
  const __m128i shift = _mm_cvtsi32_si128(reduce_bits_horiz);

  __m256i res_sub_const, round_bits_const, wt;
  unpack_weights_and_set_round_const_avx2(conv_params, round_bits, offset_bits,
                                          &res_sub_const, &round_bits_const,
                                          &wt);

  __m256i res_add_const_1;
  if (conv_params->is_compound == 1) {
    res_add_const_1 = _mm256_add_epi32(reduce_bits_vert_const, res_add_const);
  } else {
    res_add_const_1 = _mm256_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                                        ((1 << reduce_bits_vert) >> 1));
  }
  const int32_t const1 = alpha * (-4) + beta * (-4) +
                         (1 << (WARPEDDIFF_PREC_BITS - 1)) +
                         (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
  const int32_t const2 = gamma * (-4) + delta * (-4) +
                         (1 << (WARPEDDIFF_PREC_BITS - 1)) +
                         (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
  const int32_t const3 = ((1 << WARP_PARAM_REDUCE_BITS) - 1);
  const int16_t const4 = (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1));
  const int16_t const5 = (1 << (FILTER_BITS - reduce_bits_horiz));

  __m256i shuffle_src[4];
  shuffle_src[0] = _mm256_load_si256((__m256i *)shuffle_src0);
  shuffle_src[1] = _mm256_load_si256((__m256i *)shuffle_src1);
  shuffle_src[2] = _mm256_load_si256((__m256i *)shuffle_src2);
  shuffle_src[3] = _mm256_load_si256((__m256i *)shuffle_src3);

  for (i = 0; i < p_height; i += 8) {
    for (j = 0; j < p_width; j += 8) {
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      // Add in all the constant terms, including rounding and offset
      sx4 += const1;
      sy4 += const2;

      sx4 &= ~const3;
      sy4 &= ~const3;

      // Horizontal filter
      // If the block is aligned such that, after clamping, every sample
      // would be taken from the leftmost/rightmost column, then we can
      // skip the expensive horizontal filter.

      if (ix4 <= -7) {
        int iy, row = 0;
        for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
          iy = iy4 + k;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_0 =
              _mm256_set1_epi16(const4 + ref[iy * stride] * const5);
          iy = iy4 + k + 1;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_1 =
              _mm256_set1_epi16(const4 + ref[iy * stride] * const5);
          horz_out[row] = _mm256_blend_epi32(temp_0, temp_1, 0xf0);
          row += 1;
        }
        iy = iy4 + k;
        iy = clamp(iy, 0, height - 1);
        horz_out[row] = _mm256_set1_epi16(const4 + ref[iy * stride] * const5);
      } else if (ix4 >= width + 6) {
        int iy, row = 0;
        for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
          iy = iy4 + k;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_0 = _mm256_set1_epi16(
              const4 + ref[iy * stride + (width - 1)] * const5);
          iy = iy4 + k + 1;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_1 = _mm256_set1_epi16(
              const4 + ref[iy * stride + (width - 1)] * const5);
          horz_out[row] = _mm256_blend_epi32(temp_0, temp_1, 0xf0);
          row += 1;
        }
        iy = iy4 + k;
        iy = clamp(iy, 0, height - 1);
        horz_out[row] =
            _mm256_set1_epi16(const4 + ref[iy * stride + (width - 1)] * const5);
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        const int out_of_boundary_left = -(ix4 - 6);
        const int out_of_boundary_right = (ix4 + 8) - width;
        int iy, sx, row = 0;
        for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
          iy = iy4 + k;
          iy = clamp(iy, 0, height - 1);
          __m128i src0 =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
          iy = iy4 + k + 1;
          iy = clamp(iy, 0, height - 1);
          __m128i src1 =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));

          if (out_of_boundary_left >= 0) {
            const __m128i shuffle_reg_left =
                _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
            src0 = _mm_shuffle_epi8(src0, shuffle_reg_left);
            src1 = _mm_shuffle_epi8(src1, shuffle_reg_left);
          }
          if (out_of_boundary_right >= 0) {
            const __m128i shuffle_reg_right = _mm_loadu_si128(
                (__m128i *)warp_pad_right[out_of_boundary_right]);
            src0 = _mm_shuffle_epi8(src0, shuffle_reg_right);
            src1 = _mm_shuffle_epi8(src1, shuffle_reg_right);
          }
          sx = sx4 + beta * (k + 4);
          const __m256i src_01 =
              _mm256_inserti128_si256(_mm256_castsi128_si256(src0), src1, 0x1);
          horizontal_filter_avx2(src_01, horz_out, sx, alpha, beta, row,
                                 shuffle_src, &round_const, &shift);
          row += 1;
        }
        iy = iy4 + k;
        iy = clamp(iy, 0, height - 1);
        __m128i src = _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
        if (out_of_boundary_left >= 0) {
          const __m128i shuffle_reg_left =
              _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
          src = _mm_shuffle_epi8(src, shuffle_reg_left);
        }
        if (out_of_boundary_right >= 0) {
          const __m128i shuffle_reg_right =
              _mm_loadu_si128((__m128i *)warp_pad_right[out_of_boundary_right]);
          src = _mm_shuffle_epi8(src, shuffle_reg_right);
        }
        sx = sx4 + beta * (k + 4);
        const __m256i src_01 = _mm256_castsi128_si256(src);
        __m256i coeff[4];
        prepare_horizontal_filter_coeff(alpha, sx, coeff);
        filter_src_pixels_avx2(src_01, horz_out, coeff, shuffle_src,
                               &round_const, &shift, row);
      } else {
        prepare_warp_horizontal_filter_avx2(
            ref, horz_out, stride, ix4, iy4, sx4, alpha, beta, p_height, height,
            i, &round_const, &shift, shuffle_src);
      }

      // Vertical filter
      prepare_warp_vertical_filter_avx2(
          pred, horz_out, conv_params, gamma, delta, p_height, p_stride,
          p_width, i, j, sy4, reduce_bits_vert, &res_add_const_1, round_bits,
          &res_sub_const, &round_bits_const, &wt);
    }
  }
}